

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  int iVar15;
  size_t sVar16;
  void *pvVar17;
  size_t sVar18;
  int *piVar19;
  _func_int **pp_Var20;
  Layer *pLVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Allocator *pAVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  void *pvVar33;
  _func_int ***ppp_Var34;
  _func_int *p_Var35;
  ulong uVar36;
  _func_int ***ppp_Var37;
  _func_int ***ppp_Var38;
  int i_1;
  uint uVar39;
  int iVar40;
  undefined1 (*pauVar41) [16];
  pointer piVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  void *pvVar46;
  int iVar47;
  long lVar48;
  int i_2;
  long lVar49;
  uint _elempack;
  ulong uVar50;
  undefined1 (*pauVar51) [16];
  undefined1 (*pauVar52) [16];
  undefined1 (*pauVar53) [32];
  void *pvVar54;
  void *pvVar55;
  long lVar56;
  _func_int ***ppp_Var57;
  pointer piVar58;
  int j_1;
  void *pvVar59;
  float *pfVar60;
  int iVar61;
  uint uVar62;
  ulong uVar63;
  bool bVar64;
  float fVar65;
  undefined8 uVar66;
  undefined8 uVar73;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  __m128 one;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  uint local_308;
  int local_2e8;
  int local_2a8;
  Mat local_298;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  
  p_Var35 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0x10c + (long)p_Var35) != 0)) {
    iVar28 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar28;
  }
  uVar39 = bottom_blob->c;
  uVar63 = bottom_blob->elemsize;
  iVar28 = bottom_blob->elempack;
  iVar40 = *(int *)(&this->field_0xd4 + (long)p_Var35);
  iVar43 = *(int *)(&this->field_0xdc + (long)p_Var35);
  iVar61 = *(int *)(&this->field_0xd8 + (long)p_Var35);
  iVar14 = *(int *)(&this->field_0xe0 + (long)p_Var35);
  local_298.cstep = 0;
  local_298.data = (Allocator *)0x0;
  local_298.refcount._0_4_ = 0;
  local_298.refcount._4_4_ = 0;
  local_298.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_298.elempack = 0;
  local_298.h = 0;
  local_298.allocator = (Allocator *)local_298.data;
  local_298.dims = (int)local_298.refcount;
  local_298.w = local_298.refcount._4_4_;
  local_298.d = (int)local_298.refcount;
  local_298.c = local_298.elempack;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_fma +
             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]),bottom_blob,&local_298,opt);
  iVar26 = local_298.w;
  iVar44 = -100;
  local_238 = CONCAT44(local_238._4_4_,(undefined4)local_238);
  local_248 = CONCAT44(local_248._4_4_,(int)local_248);
  if (((Allocator *)local_298.data == (Allocator *)0x0) ||
     (local_238 = CONCAT44(local_238._4_4_,(undefined4)local_238),
     local_248 = CONCAT44(local_248._4_4_,(int)local_248), (long)local_298.c * local_298.cstep == 0)
     ) goto LAB_003e5288;
  p_Var35 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar40 = (~((iVar40 + -1) * iVar43) + local_298.w) / *(int *)(&this->field_0xe4 + (long)p_Var35);
  iVar43 = iVar40 + 1;
  local_2e8 = (~((iVar61 + -1) * iVar14) + local_298.h) /
              *(int *)(&this->field_0xe8 + (long)p_Var35);
  local_248._0_4_ = local_2e8 + 1;
  uVar62 = *(uint *)(&this->field_0xd0 + (long)p_Var35);
  if (opt->use_packing_layout == true) {
    uVar50 = (ulong)((uVar62 & 3) == 0) * 3 + 1;
    if ((uVar62 & 7) == 0) {
      uVar50 = 8;
    }
  }
  else {
    uVar50 = 1;
  }
  _elempack = (uint)uVar50;
  local_238 = (uVar63 / (ulong)(long)iVar28) * uVar50;
  Mat::create(top_blob,iVar43,(int)local_248,(int)uVar62 / (int)_elempack,local_238,_elempack,
              opt->blob_allocator);
  sVar18 = local_298.cstep;
  iVar27 = local_298.d;
  iVar47 = local_298.h;
  iVar14 = local_298.w;
  pAVar25 = local_298.allocator;
  iVar61 = local_298.elempack;
  pvVar59 = top_blob->data;
  if ((pvVar59 == (void *)0x0) || (sVar16 = top_blob->cstep, (long)top_blob->c * sVar16 == 0))
  goto LAB_003e5288;
  iVar29 = iVar28 * uVar39;
  p_Var35 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar44 = *(int *)(&this->field_0xd0 + (long)p_Var35);
  iVar15 = *(int *)(&this->field_0x108 + (long)p_Var35);
  if ((iVar29 == iVar15) && (iVar29 == iVar44)) {
    iVar44 = iVar29;
    if (iVar28 == 1) {
      if ((*(int *)(&this->field_0xd4 + (long)p_Var35) != 3) ||
         (*(int *)(&this->field_0xd8 + (long)p_Var35) != 3)) goto LAB_003e3657;
      if ((*(int *)(&this->field_0xdc + (long)p_Var35) == 1) &&
         (((*(int *)(&this->field_0xe0 + (long)p_Var35) == 1 &&
           (*(int *)(&this->field_0xe4 + (long)p_Var35) == 1)) &&
          (*(int *)(&this->field_0xe8 + (long)p_Var35) == 1)))) {
        lVar49 = (long)local_298.w;
        iVar28 = top_blob->w;
        iVar40 = top_blob->h;
        pvVar17 = (this->weight_data_tm).data;
        sVar18 = top_blob->elemsize;
        local_238 = *(ulong *)(&this->field_0x1b0 + (long)p_Var35);
        lVar32 = (long)iVar28;
        local_228._0_8_ = lVar49 * 3;
        local_248 = (long)local_298.w;
        uVar63 = 0;
        uVar39 = local_298.c;
        if (local_298.c < 1) {
          uVar39 = 0;
        }
        lVar48 = (long)(local_298.w + 2) * 4;
        for (; uVar63 != uVar39; uVar63 = uVar63 + 1) {
          if (local_238 == 0) {
            fVar65 = 0.0;
          }
          else {
            fVar65 = *(float *)(local_238 + uVar63 * 4);
          }
          pvVar46 = (void *)(sVar16 * sVar18 * uVar63 + (long)pvVar59);
          lVar45 = uVar63 * 0x24;
          ppp_Var38 = (_func_int ***)
                      ((long)(_func_int ***)local_298.data +
                      local_298.elemsize * local_298.cstep * uVar63);
          piVar42 = (pointer)((long)ppp_Var38 + (long)local_298.w * 4);
          ppp_Var37 = ppp_Var38 + lVar49;
          piVar58 = (pointer)((long)ppp_Var38 + lVar49 * 0xc);
          pvVar33 = pvVar46;
          for (uVar62 = 0; (int)(uVar62 | 1) < iVar40; uVar62 = uVar62 + 2) {
            lVar56 = 0;
            for (iVar43 = iVar28; 0 < iVar43; iVar43 = iVar43 + -1) {
              auVar133._8_8_ = 0;
              auVar133._0_8_ = *(ulong *)((long)ppp_Var38 + lVar56 + 4);
              auVar83 = vmovlhps_avx(ZEXT416(*(uint *)((long)ppp_Var38 + lVar56)),auVar133);
              auVar83 = vshufps_avx(auVar83,auVar133,0xd8);
              auVar133 = vinsertps_avx(auVar83,ZEXT416((uint)*(float *)((long)piVar42 + lVar56)),
                                       0x30);
              auVar83 = *(undefined1 (*) [16])((long)pvVar17 + lVar45);
              pfVar60 = (float *)((long)pvVar17 + lVar45 + 0x10);
              auVar115._8_8_ = 0;
              auVar115._0_8_ = *(ulong *)((long)piVar42 + lVar56 + 4);
              auVar78 = vinsertps_avx(auVar115,ZEXT416(*(uint *)((long)ppp_Var37 + lVar56)),0x20);
              auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)((long)ppp_Var37 + lVar56 + 4)),0x30)
              ;
              auVar119._0_4_ = *pfVar60 * auVar78._0_4_;
              auVar119._4_4_ = pfVar60[1] * auVar78._4_4_;
              auVar119._8_4_ = pfVar60[2] * auVar78._8_4_;
              auVar119._12_4_ = pfVar60[3] * auVar78._12_4_;
              auVar78 = vhaddps_avx(auVar119,auVar119);
              auVar74._0_4_ = auVar83._0_4_ * auVar133._0_4_;
              auVar74._4_4_ = auVar83._4_4_ * auVar133._4_4_;
              auVar74._8_4_ = auVar83._8_4_ * auVar133._8_4_;
              auVar74._12_4_ = auVar83._12_4_ * auVar133._12_4_;
              auVar78 = vhaddps_avx(auVar78,auVar78);
              auVar133 = vhaddps_avx(auVar74,auVar74);
              auVar133 = vhaddps_avx(auVar133,auVar133);
              auVar119 = ZEXT416(*(uint *)((long)pvVar17 + lVar45 + 0x20));
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar133._0_4_)),auVar119,
                                        ZEXT416(*(uint *)((long)(ppp_Var37 + 1) + lVar56)));
              auVar78 = vmovlhps_avx(auVar83,auVar115);
              auVar78 = vshufps_avx(auVar78,auVar115,0xd8);
              auVar133 = vinsertps_avx(auVar78,ZEXT416(*(uint *)((long)ppp_Var37 + lVar56)),0x30);
              auVar117._8_8_ = 0;
              auVar117._0_8_ = *(ulong *)((long)ppp_Var37 + lVar56 + 4);
              auVar78 = vmovhps_avx(auVar117,*(undefined8 *)((long)piVar58 + lVar56));
              auVar105._0_4_ = auVar78._0_4_ * *pfVar60;
              auVar105._4_4_ = auVar78._4_4_ * pfVar60[1];
              auVar105._8_4_ = auVar78._8_4_ * pfVar60[2];
              auVar105._12_4_ = auVar78._12_4_ * pfVar60[3];
              auVar78 = vhaddps_avx(auVar105,auVar105);
              auVar78 = vhaddps_avx(auVar78,auVar78);
              auVar88._0_4_ = auVar133._0_4_ * *(float *)((long)piVar42 + lVar56);
              auVar88._4_4_ = auVar133._4_4_ * auVar83._4_4_;
              auVar88._8_4_ = auVar133._8_4_ * auVar83._8_4_;
              auVar88._12_4_ = auVar133._12_4_ * auVar83._12_4_;
              auVar83 = vhaddps_avx(auVar88,auVar88);
              auVar83 = vhaddps_avx(auVar83,auVar83);
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar83._0_4_)),auVar119,
                                        ZEXT416(*(uint *)((long)piVar58 + lVar56 + 8)));
              *(float *)((long)pvVar46 + lVar56) = auVar74._0_4_ + fVar65;
              *(float *)((long)pvVar33 + lVar56 + lVar32 * 4) = auVar83._0_4_ + fVar65;
              lVar56 = lVar56 + 4;
            }
            ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar56 + lVar48);
            piVar42 = (pointer)((long)piVar42 + lVar56 + lVar48);
            ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar56 + lVar48);
            piVar58 = (pointer)((long)piVar58 + lVar56 + lVar48);
            pvVar46 = (void *)((long)pvVar46 + lVar56 + lVar32 * 4);
            pvVar33 = (void *)((long)pvVar33 + lVar56 + lVar32 * 4);
          }
          for (; (int)uVar62 < iVar40; uVar62 = uVar62 + 1) {
            lVar56 = 0;
            for (iVar43 = iVar28; 0 < iVar43; iVar43 = iVar43 + -1) {
              auVar75._8_8_ = 0;
              auVar75._0_8_ = *(ulong *)((long)ppp_Var38 + lVar56);
              auVar83 = vinsertps_avx(auVar75,ZEXT416(*(uint *)((long)(ppp_Var38 + 1) + lVar56)),
                                      0x20);
              auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)piVar42 + lVar56)),0x30);
              auVar102._16_8_ = *(undefined8 *)((long)piVar42 + lVar56 + 4);
              auVar102._0_16_ = auVar83;
              auVar102._24_8_ = 0;
              auVar86._16_8_ = *(undefined8 *)((long)ppp_Var37 + lVar56);
              auVar86._0_16_ = auVar83;
              auVar86._24_8_ = 0;
              auVar87 = vshufpd_avx(auVar102,auVar86,2);
              pfVar60 = (float *)((long)pvVar17 + lVar45);
              auVar76._0_4_ = auVar87._0_4_ * *pfVar60;
              auVar76._4_4_ = auVar87._4_4_ * pfVar60[1];
              auVar76._8_4_ = auVar87._8_4_ * pfVar60[2];
              auVar76._12_4_ = auVar87._12_4_ * pfVar60[3];
              auVar8._16_4_ = auVar87._16_4_ * pfVar60[4];
              auVar8._0_16_ = auVar76;
              auVar8._20_4_ = auVar87._20_4_ * pfVar60[5];
              auVar8._24_4_ = auVar87._24_4_ * pfVar60[6];
              auVar8._28_4_ = auVar87._28_4_;
              auVar83 = vhaddps_avx(auVar8._16_16_,auVar76);
              auVar83 = vhaddps_avx(auVar83,auVar83);
              auVar83 = vhaddps_avx(auVar83,auVar83);
              auVar83 = vfmadd231ss_fma(auVar83,ZEXT416(*(uint *)((long)pvVar17 + lVar45 + 0x20)),
                                        ZEXT416(*(uint *)((long)(ppp_Var37 + 1) + lVar56)));
              *(float *)((long)pvVar46 + lVar56) = auVar83._0_4_ + fVar65;
              lVar56 = lVar56 + 4;
            }
            ppp_Var38 = (_func_int ***)((long)(ppp_Var38 + 1) + lVar56);
            piVar42 = (pointer)((long)piVar42 + lVar56 + 8);
            ppp_Var37 = (_func_int ***)((long)(ppp_Var37 + 1) + lVar56);
            pvVar46 = (void *)((long)pvVar46 + lVar56);
          }
        }
      }
      else {
        if ((((*(int *)(&this->field_0xdc + (long)p_Var35) != 1) ||
             (*(int *)(&this->field_0xe0 + (long)p_Var35) != 1)) ||
            (*(int *)(&this->field_0xe4 + (long)p_Var35) != 2)) ||
           (*(int *)(&this->field_0xe8 + (long)p_Var35) != 2)) goto LAB_003e3657;
        iVar28 = top_blob->w;
        pvVar17 = (this->weight_data_tm).data;
        lVar49 = *(long *)(&this->field_0x1b0 + (long)p_Var35);
        sVar18 = top_blob->elemsize;
        local_248 = (long)local_298.w * 2;
        uVar50 = 0;
        uVar63 = (ulong)(uint)top_blob->h;
        if (top_blob->h < 1) {
          uVar63 = uVar50;
        }
        uVar31 = (ulong)(uint)local_298.c;
        if (local_298.c < 1) {
          uVar31 = uVar50;
        }
        lVar32 = (long)((local_298.w - iVar28) * 2) * 4;
        for (; uVar50 != uVar31; uVar50 = uVar50 + 1) {
          if (lVar49 == 0) {
            fVar65 = 0.0;
          }
          else {
            fVar65 = *(float *)(lVar49 + uVar50 * 4);
          }
          pfVar60 = (float *)(sVar16 * sVar18 * uVar50 + (long)pvVar59);
          ppp_Var38 = (_func_int ***)
                      ((long)(_func_int ***)local_298.data +
                      local_298.elemsize * local_298.cstep * uVar50);
          piVar42 = (pointer)((long)ppp_Var38 + (long)local_298.w * 4);
          ppp_Var37 = ppp_Var38 + local_298.w;
          for (iVar40 = 0; iVar40 != (int)uVar63; iVar40 = iVar40 + 1) {
            lVar48 = 0;
            for (iVar43 = iVar28; 0 < iVar43; iVar43 = iVar43 + -1) {
              auVar83._8_8_ = 0;
              auVar83._0_8_ = *(ulong *)((long)ppp_Var38 + lVar48);
              auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)(ppp_Var38 + 1) + lVar48)),
                                      0x20);
              auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)piVar42 + lVar48)),0x30);
              auVar103._16_8_ = *(undefined8 *)((long)piVar42 + lVar48 + 4);
              auVar103._0_16_ = auVar83;
              auVar103._24_8_ = 0;
              auVar87._16_8_ = *(undefined8 *)((long)ppp_Var37 + lVar48);
              auVar87._0_16_ = auVar83;
              auVar87._24_8_ = 0;
              auVar87 = vshufpd_avx(auVar103,auVar87,2);
              pfVar2 = (float *)((long)pvVar17 + uVar50 * 0x24);
              auVar78._0_4_ = auVar87._0_4_ * *pfVar2;
              auVar78._4_4_ = auVar87._4_4_ * pfVar2[1];
              auVar78._8_4_ = auVar87._8_4_ * pfVar2[2];
              auVar78._12_4_ = auVar87._12_4_ * pfVar2[3];
              auVar7._16_4_ = auVar87._16_4_ * pfVar2[4];
              auVar7._0_16_ = auVar78;
              auVar7._20_4_ = auVar87._20_4_ * pfVar2[5];
              auVar7._24_4_ = auVar87._24_4_ * pfVar2[6];
              auVar7._28_4_ = auVar87._28_4_;
              auVar83 = vhaddps_avx(auVar7._16_16_,auVar78);
              auVar83 = vhaddps_avx(auVar83,auVar83);
              auVar83 = vhaddps_avx(auVar83,auVar83);
              auVar83 = vfmadd231ss_fma(auVar83,ZEXT416(*(uint *)((long)pvVar17 +
                                                                 uVar50 * 0x24 + 0x20)),
                                        ZEXT416(*(uint *)((long)(ppp_Var37 + 1) + lVar48)));
              *pfVar60 = auVar83._0_4_ + fVar65;
              pfVar60 = pfVar60 + 1;
              lVar48 = lVar48 + 8;
            }
            ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar48 + lVar32);
            piVar42 = (pointer)((long)piVar42 + lVar48 + lVar32);
            ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar48 + lVar32);
          }
        }
      }
LAB_003e52dd:
      pLVar21 = this->activation;
      if (pLVar21 != (Layer *)0x0) {
        (*pLVar21->_vptr_Layer[9])(pLVar21,top_blob,opt);
      }
    }
    else {
      if (iVar28 == 4) {
        iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var35);
        iVar61 = *(int *)(&this->field_0xd8 + (long)p_Var35);
        if (iVar28 == 5) {
          if (iVar61 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var35) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var35) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var35) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var35) == 1)))) {
              uVar39 = top_blob->w;
              iVar28 = top_blob->h;
              lVar49 = *(long *)(&this->field_0x1b0 + (long)p_Var35);
              uVar50 = 0;
              uVar63 = (ulong)uVar39;
              if ((int)uVar39 < 1) {
                uVar63 = uVar50;
              }
              uVar31 = (ulong)(uint)local_298.c;
              if (local_298.c < 1) {
                uVar31 = uVar50;
              }
              lVar48 = (long)(local_298.w * 4 + 0x10) * 4;
              lVar32 = (long)(int)(uVar39 * 4) * 4;
              for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar50 != uVar31;
                  uVar50 = uVar50 + 1) {
                if (lVar49 == 0) {
                  auVar83 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar83 = *(undefined1 (*) [16])(lVar49 + uVar50 * 0x10);
                }
                pvVar55 = (void *)(top_blob->cstep * uVar50 * top_blob->elemsize +
                                  (long)top_blob->data);
                pvVar17 = (this->weight_data_tm).data;
                lVar56 = (long)(this->weight_data_tm).w * uVar50 * (this->weight_data_tm).elemsize;
                pvVar54 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar55);
                ppp_Var38 = (_func_int ***)
                            ((long)(_func_int ***)local_298.data +
                            local_298.cstep * uVar50 * local_298.elemsize);
                lVar45 = (long)local_298.w * local_298.elemsize;
                ppp_Var37 = (_func_int ***)((long)ppp_Var38 + lVar45);
                pvVar59 = (void *)((long)ppp_Var38 + lVar45 * 2);
                pvVar46 = (void *)((long)ppp_Var38 + lVar45 * 3);
                piVar42 = (pointer)((long)ppp_Var38 + lVar45 * 4);
                pvVar33 = (void *)((long)ppp_Var38 + lVar45 * 5);
                for (uVar39 = 0; (int)(uVar39 | 1) < iVar28; uVar39 = uVar39 + 2) {
                  lVar45 = 0;
                  uVar36 = uVar63;
                  while (iVar40 = (int)uVar36, uVar36 = (ulong)(iVar40 - 1), iVar40 != 0) {
                    auVar78 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x10);
                    auVar133 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x20);
                    auVar74 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x30);
                    auVar88 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var38 + lVar45),
                                              *(undefined1 (*) [16])((long)pvVar17 + lVar56),auVar83
                                             );
                    auVar88 = vfmadd231ps_fma(auVar88,auVar78,
                                              *(undefined1 (*) [16])((long)(ppp_Var38 + 2) + lVar45)
                                             );
                    auVar88 = vfmadd231ps_fma(auVar88,auVar133,
                                              *(undefined1 (*) [16])((long)(ppp_Var38 + 4) + lVar45)
                                             );
                    auVar105 = vfmadd231ps_fma(auVar88,auVar74,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var38 + 6) + lVar45));
                    auVar88 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x40);
                    auVar115 = vfmadd231ps_fma(auVar105,auVar88,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var38 + 8) + lVar45));
                    auVar105 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar56),
                                               *(undefined1 (*) [16])((long)ppp_Var37 + lVar45),
                                               auVar83);
                    auVar78 = vfmadd231ps_fma(auVar105,*(undefined1 (*) [16])
                                                        ((long)(ppp_Var37 + 2) + lVar45),auVar78);
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)(ppp_Var37 + 4) + lVar45),auVar133);
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)(ppp_Var37 + 6) + lVar45),auVar74);
                    auVar76 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)(ppp_Var37 + 8) + lVar45),auVar88);
                    auVar78 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x50);
                    auVar133 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x60);
                    auVar74 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x70);
                    auVar88 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x80);
                    auVar105 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x90);
                    auVar115 = vfmadd231ps_fma(auVar115,auVar78,
                                               *(undefined1 (*) [16])((long)ppp_Var37 + lVar45));
                    auVar115 = vfmadd231ps_fma(auVar115,auVar133,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var37 + 2) + lVar45));
                    auVar115 = vfmadd231ps_fma(auVar115,auVar74,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var37 + 4) + lVar45));
                    auVar115 = vfmadd231ps_fma(auVar115,auVar88,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var37 + 6) + lVar45));
                    auVar104 = vfmadd231ps_fma(auVar115,auVar105,
                                               *(undefined1 (*) [16])
                                                ((long)(ppp_Var37 + 8) + lVar45));
                    auVar115 = *(undefined1 (*) [16])((long)pvVar59 + lVar45 + 0x10);
                    auVar117 = *(undefined1 (*) [16])((long)pvVar59 + lVar45 + 0x20);
                    auVar119 = *(undefined1 (*) [16])((long)pvVar59 + lVar45 + 0x30);
                    auVar75 = *(undefined1 (*) [16])((long)pvVar59 + lVar45 + 0x40);
                    auVar78 = vfmadd231ps_fma(auVar76,*(undefined1 (*) [16])((long)pvVar59 + lVar45)
                                              ,auVar78);
                    auVar78 = vfmadd231ps_fma(auVar78,auVar115,auVar133);
                    auVar78 = vfmadd231ps_fma(auVar78,auVar117,auVar74);
                    auVar78 = vfmadd231ps_fma(auVar78,auVar119,auVar88);
                    auVar76 = vfmadd231ps_fma(auVar78,auVar75,auVar105);
                    auVar78 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0xa0);
                    auVar133 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0xb0);
                    auVar74 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0xc0);
                    auVar88 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0xd0);
                    auVar105 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0xe0);
                    auVar104 = vfmadd231ps_fma(auVar104,auVar78,
                                               *(undefined1 (*) [16])((long)pvVar59 + lVar45));
                    auVar115 = vfmadd231ps_fma(auVar104,auVar133,auVar115);
                    auVar115 = vfmadd231ps_fma(auVar115,auVar74,auVar117);
                    auVar115 = vfmadd231ps_fma(auVar115,auVar88,auVar119);
                    auVar104 = vfmadd231ps_fma(auVar115,auVar105,auVar75);
                    auVar115 = *(undefined1 (*) [16])((long)pvVar46 + lVar45 + 0x10);
                    auVar117 = *(undefined1 (*) [16])((long)pvVar46 + lVar45 + 0x20);
                    auVar119 = *(undefined1 (*) [16])((long)pvVar46 + lVar45 + 0x30);
                    auVar75 = *(undefined1 (*) [16])((long)pvVar46 + lVar45 + 0x40);
                    auVar78 = vfmadd231ps_fma(auVar76,*(undefined1 (*) [16])((long)pvVar46 + lVar45)
                                              ,auVar78);
                    auVar78 = vfmadd231ps_fma(auVar78,auVar115,auVar133);
                    auVar78 = vfmadd231ps_fma(auVar78,auVar117,auVar74);
                    auVar78 = vfmadd231ps_fma(auVar78,auVar119,auVar88);
                    auVar76 = vfmadd231ps_fma(auVar78,auVar75,auVar105);
                    auVar78 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0xf0);
                    auVar133 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x100);
                    auVar74 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x110);
                    auVar88 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x120);
                    auVar105 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x130);
                    auVar104 = vfmadd231ps_fma(auVar104,auVar78,
                                               *(undefined1 (*) [16])((long)pvVar46 + lVar45));
                    auVar115 = vfmadd231ps_fma(auVar104,auVar133,auVar115);
                    auVar115 = vfmadd231ps_fma(auVar115,auVar74,auVar117);
                    auVar115 = vfmadd231ps_fma(auVar115,auVar88,auVar119);
                    auVar104 = vfmadd231ps_fma(auVar115,auVar105,auVar75);
                    auVar115 = *(undefined1 (*) [16])((long)piVar42 + lVar45 + 0x10);
                    auVar117 = *(undefined1 (*) [16])((long)piVar42 + lVar45 + 0x20);
                    auVar119 = *(undefined1 (*) [16])((long)piVar42 + lVar45 + 0x30);
                    auVar75 = *(undefined1 (*) [16])((long)piVar42 + lVar45 + 0x40);
                    auVar78 = vfmadd231ps_fma(auVar76,*(undefined1 (*) [16])((long)piVar42 + lVar45)
                                              ,auVar78);
                    auVar78 = vfmadd231ps_fma(auVar78,auVar115,auVar133);
                    auVar78 = vfmadd231ps_fma(auVar78,auVar117,auVar74);
                    auVar78 = vfmadd231ps_fma(auVar78,auVar119,auVar88);
                    auVar76 = vfmadd231ps_fma(auVar78,auVar75,auVar105);
                    auVar78 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x140);
                    auVar133 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x150);
                    auVar74 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x160);
                    auVar88 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x170);
                    auVar105 = *(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x180);
                    auVar104 = vfmadd231ps_fma(auVar104,auVar78,
                                               *(undefined1 (*) [16])((long)piVar42 + lVar45));
                    auVar115 = vfmadd231ps_fma(auVar104,auVar133,auVar115);
                    auVar115 = vfmadd231ps_fma(auVar115,auVar74,auVar117);
                    auVar115 = vfmadd231ps_fma(auVar115,auVar88,auVar119);
                    auVar78 = vfmadd231ps_fma(auVar76,auVar78,
                                              *(undefined1 (*) [16])((long)pvVar33 + lVar45));
                    auVar78 = vfmadd231ps_fma(auVar78,auVar133,
                                              *(undefined1 (*) [16])((long)pvVar33 + lVar45 + 0x10))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,auVar74,
                                              *(undefined1 (*) [16])((long)pvVar33 + lVar45 + 0x20))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,auVar88,
                                              *(undefined1 (*) [16])((long)pvVar33 + lVar45 + 0x30))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,auVar105,
                                              *(undefined1 (*) [16])((long)pvVar33 + lVar45 + 0x40))
                    ;
                    auVar133 = vfmadd231ps_fma(auVar115,auVar105,auVar75);
                    *(undefined1 (*) [16])((long)pvVar55 + lVar45) = auVar133;
                    *(undefined1 (*) [16])((long)pvVar54 + lVar45) = auVar78;
                    lVar45 = lVar45 + 0x10;
                  }
                  ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar45 + lVar48);
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar45 + lVar48);
                  pvVar59 = (void *)((long)pvVar59 + lVar45 + lVar48);
                  pvVar46 = (void *)((long)pvVar46 + lVar45 + lVar48);
                  piVar42 = (pointer)((long)piVar42 + lVar45 + lVar48);
                  pvVar33 = (void *)((long)pvVar33 + lVar45 + lVar48);
                  pvVar55 = (void *)((long)pvVar55 + lVar45 + lVar32);
                  pvVar54 = (void *)((long)pvVar54 + lVar45 + lVar32);
                }
                for (; (int)uVar39 < iVar28; uVar39 = uVar39 + 1) {
                  lVar45 = 0;
                  uVar36 = uVar63;
                  while (iVar40 = (int)uVar36, uVar36 = (ulong)(iVar40 - 1), iVar40 != 0) {
                    auVar78 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar56),auVar83
                                              ,*(undefined1 (*) [16])((long)ppp_Var38 + lVar45));
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x10),
                                              *(undefined1 (*) [16])((long)(ppp_Var38 + 2) + lVar45)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x20),
                                              *(undefined1 (*) [16])((long)(ppp_Var38 + 4) + lVar45)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x30),
                                              *(undefined1 (*) [16])((long)(ppp_Var38 + 6) + lVar45)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x40),
                                              *(undefined1 (*) [16])((long)(ppp_Var38 + 8) + lVar45)
                                             );
                    auVar78 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x50),
                                              auVar78,*(undefined1 (*) [16])
                                                       ((long)ppp_Var37 + lVar45));
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x60),
                                              *(undefined1 (*) [16])((long)(ppp_Var37 + 2) + lVar45)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x70),
                                              *(undefined1 (*) [16])((long)(ppp_Var37 + 4) + lVar45)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x80),
                                              *(undefined1 (*) [16])((long)(ppp_Var37 + 6) + lVar45)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x90),
                                              *(undefined1 (*) [16])((long)(ppp_Var37 + 8) + lVar45)
                                             );
                    auVar78 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0xa0),
                                              auVar78,*(undefined1 (*) [16])((long)pvVar59 + lVar45)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0xb0),
                                              *(undefined1 (*) [16])((long)pvVar59 + lVar45 + 0x10))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0xc0),
                                              *(undefined1 (*) [16])((long)pvVar59 + lVar45 + 0x20))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0xd0),
                                              *(undefined1 (*) [16])((long)pvVar59 + lVar45 + 0x30))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0xe0),
                                              *(undefined1 (*) [16])((long)pvVar59 + lVar45 + 0x40))
                    ;
                    auVar78 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0xf0),
                                              auVar78,*(undefined1 (*) [16])((long)pvVar46 + lVar45)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x100),
                                              *(undefined1 (*) [16])((long)pvVar46 + lVar45 + 0x10))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x110),
                                              *(undefined1 (*) [16])((long)pvVar46 + lVar45 + 0x20))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x120),
                                              *(undefined1 (*) [16])((long)pvVar46 + lVar45 + 0x30))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x130),
                                              *(undefined1 (*) [16])((long)pvVar46 + lVar45 + 0x40))
                    ;
                    auVar78 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar56 + 0x140)
                                              ,auVar78,*(undefined1 (*) [16])
                                                        ((long)piVar42 + lVar45));
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x150),
                                              *(undefined1 (*) [16])((long)piVar42 + lVar45 + 0x10))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x160),
                                              *(undefined1 (*) [16])((long)piVar42 + lVar45 + 0x20))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x170),
                                              *(undefined1 (*) [16])((long)piVar42 + lVar45 + 0x30))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar56 + 0x180),
                                              *(undefined1 (*) [16])((long)piVar42 + lVar45 + 0x40))
                    ;
                    *(undefined1 (*) [16])((long)pvVar55 + lVar45) = auVar78;
                    lVar45 = lVar45 + 0x10;
                  }
                  ppp_Var38 = (_func_int ***)((long)(ppp_Var38 + 8) + lVar45);
                  ppp_Var37 = (_func_int ***)((long)(ppp_Var37 + 8) + lVar45);
                  pvVar59 = (void *)((long)pvVar59 + lVar45 + 0x40);
                  pvVar46 = (void *)((long)pvVar46 + lVar45 + 0x40);
                  piVar42 = (pointer)((long)piVar42 + lVar45 + 0x40);
                  pvVar55 = (void *)((long)pvVar55 + lVar45);
                }
              }
            }
            else {
              iVar61 = 5;
              if ((((*(int *)(&this->field_0xdc + (long)p_Var35) != 1) ||
                   (*(int *)(&this->field_0xe0 + (long)p_Var35) != 1)) ||
                  (*(int *)(&this->field_0xe4 + (long)p_Var35) != 2)) ||
                 (*(int *)(&this->field_0xe8 + (long)p_Var35) != 2)) goto LAB_003e4230;
              iVar28 = top_blob->w;
              iVar40 = local_298.w - iVar28;
              lVar49 = *(long *)(&this->field_0x1b0 + (long)p_Var35);
              uVar63 = 0;
              if (iVar28 < 1) {
                iVar28 = 0;
              }
              uVar50 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar50 = uVar63;
              }
              uVar31 = (ulong)(uint)local_298.c;
              if (local_298.c < 1) {
                uVar31 = uVar63;
              }
              lVar32 = (long)(iVar40 * 8) * 4;
              for (; uVar63 != uVar31; uVar63 = uVar63 + 1) {
                if (lVar49 == 0) {
                  auVar83 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar83 = *(undefined1 (*) [16])(lVar49 + uVar63 * 0x10);
                }
                pauVar52 = (undefined1 (*) [16])
                           (top_blob->cstep * uVar63 * top_blob->elemsize + (long)top_blob->data);
                pvVar17 = (this->weight_data_tm).data;
                lVar45 = (long)(this->weight_data_tm).w * uVar63 * (this->weight_data_tm).elemsize;
                ppp_Var38 = (_func_int ***)
                            ((long)(_func_int ***)local_298.data +
                            local_298.cstep * uVar63 * local_298.elemsize);
                lVar48 = (long)local_298.w * local_298.elemsize;
                ppp_Var37 = (_func_int ***)((long)ppp_Var38 + lVar48);
                pvVar59 = (void *)((long)ppp_Var38 + lVar48 * 2);
                pvVar33 = (void *)((long)ppp_Var38 + lVar48 * 3);
                piVar42 = (pointer)((long)ppp_Var38 + lVar48 * 4);
                for (iVar40 = 0; iVar40 != (int)uVar50; iVar40 = iVar40 + 1) {
                  lVar48 = 0;
                  iVar43 = iVar28;
                  while (bVar64 = iVar43 != 0, iVar43 = iVar43 + -1, bVar64) {
                    auVar78 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar45),auVar83
                                              ,*(undefined1 (*) [16])((long)ppp_Var38 + lVar48));
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x10),
                                              *(undefined1 (*) [16])((long)(ppp_Var38 + 2) + lVar48)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x20),
                                              *(undefined1 (*) [16])((long)(ppp_Var38 + 4) + lVar48)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x30),
                                              *(undefined1 (*) [16])((long)(ppp_Var38 + 6) + lVar48)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x40),
                                              *(undefined1 (*) [16])((long)(ppp_Var38 + 8) + lVar48)
                                             );
                    auVar78 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar45 + 0x50),
                                              auVar78,*(undefined1 (*) [16])
                                                       ((long)ppp_Var37 + lVar48));
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x60),
                                              *(undefined1 (*) [16])((long)(ppp_Var37 + 2) + lVar48)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x70),
                                              *(undefined1 (*) [16])((long)(ppp_Var37 + 4) + lVar48)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x80),
                                              *(undefined1 (*) [16])((long)(ppp_Var37 + 6) + lVar48)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x90),
                                              *(undefined1 (*) [16])((long)(ppp_Var37 + 8) + lVar48)
                                             );
                    auVar78 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar45 + 0xa0),
                                              auVar78,*(undefined1 (*) [16])((long)pvVar59 + lVar48)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0xb0),
                                              *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x10))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0xc0),
                                              *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x20))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0xd0),
                                              *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x30))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0xe0),
                                              *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x40))
                    ;
                    auVar78 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar45 + 0xf0),
                                              auVar78,*(undefined1 (*) [16])((long)pvVar33 + lVar48)
                                             );
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x100),
                                              *(undefined1 (*) [16])((long)pvVar33 + lVar48 + 0x10))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x110),
                                              *(undefined1 (*) [16])((long)pvVar33 + lVar48 + 0x20))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x120),
                                              *(undefined1 (*) [16])((long)pvVar33 + lVar48 + 0x30))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x130),
                                              *(undefined1 (*) [16])((long)pvVar33 + lVar48 + 0x40))
                    ;
                    auVar78 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar17 + lVar45 + 0x140)
                                              ,auVar78,*(undefined1 (*) [16])
                                                        ((long)piVar42 + lVar48));
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x150),
                                              *(undefined1 (*) [16])((long)piVar42 + lVar48 + 0x10))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x160),
                                              *(undefined1 (*) [16])((long)piVar42 + lVar48 + 0x20))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x170),
                                              *(undefined1 (*) [16])((long)piVar42 + lVar48 + 0x30))
                    ;
                    auVar78 = vfmadd231ps_fma(auVar78,*(undefined1 (*) [16])
                                                       ((long)pvVar17 + lVar45 + 0x180),
                                              *(undefined1 (*) [16])((long)piVar42 + lVar48 + 0x40))
                    ;
                    *pauVar52 = auVar78;
                    pauVar52 = pauVar52 + 1;
                    lVar48 = lVar48 + 0x20;
                  }
                  ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar48 + lVar32);
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar48 + lVar32);
                  pvVar59 = (void *)((long)pvVar59 + lVar48 + lVar32);
                  pvVar33 = (void *)((long)pvVar33 + lVar48 + lVar32);
                  piVar42 = (pointer)((long)piVar42 + lVar48 + lVar32);
                }
              }
            }
            goto LAB_003e52dd;
          }
        }
        else if ((iVar28 == 3) && (iVar61 == 3)) {
          if (((*(int *)(&this->field_0xdc + (long)p_Var35) == 1) &&
              ((*(int *)(&this->field_0xe0 + (long)p_Var35) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var35) == 1)))) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var35) == 1)) {
            iVar28 = top_blob->w;
            lVar49 = *(long *)(&this->field_0x1b0 + (long)p_Var35);
            uVar50 = 0;
            uVar63 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar63 = uVar50;
            }
            uVar31 = (ulong)(uint)local_298.c;
            if (local_298.c < 1) {
              uVar31 = uVar50;
            }
            for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar50 != uVar31;
                uVar50 = uVar50 + 1) {
              if (lVar49 == 0) {
                uVar66 = 0;
                uVar73 = 0;
              }
              else {
                puVar1 = (undefined8 *)(lVar49 + uVar50 * 0x10);
                uVar66 = *puVar1;
                uVar73 = puVar1[1];
              }
              pauVar51 = (undefined1 (*) [16])
                         (top_blob->cstep * uVar50 * top_blob->elemsize + (long)top_blob->data);
              pvVar59 = (this->weight_data_tm).data;
              lVar32 = (long)(this->weight_data_tm).w * uVar50 * (this->weight_data_tm).elemsize;
              ppp_Var38 = (_func_int ***)
                          ((long)(_func_int ***)local_298.data +
                          local_298.cstep * uVar50 * local_298.elemsize);
              pauVar41 = (undefined1 (*) [16])
                         ((long)ppp_Var38 + (long)local_298.w * local_298.elemsize * 2);
              pauVar52 = (undefined1 (*) [16])((long)pvVar59 + lVar32);
              auVar124 = *pauVar52;
              auVar111 = *pauVar52;
              auVar77 = *pauVar52;
              auVar133 = *pauVar52;
              pauVar52 = (undefined1 (*) [16])((long)pvVar59 + lVar32 + 0x10);
              auVar125 = *pauVar52;
              auVar112 = *pauVar52;
              auVar109 = *pauVar52;
              auVar107 = *pauVar52;
              auVar94 = *pauVar52;
              auVar79 = *pauVar52;
              auVar68 = *pauVar52;
              auVar22 = *pauVar52;
              auVar84 = *pauVar52;
              auVar141 = *pauVar52;
              auVar118 = *pauVar52;
              auVar104 = *pauVar52;
              auVar75 = *pauVar52;
              auVar74 = *pauVar52;
              pauVar52 = (undefined1 (*) [16])((long)pvVar59 + lVar32 + 0x20);
              uStack_240 = *(undefined8 *)(*pauVar52 + 8);
              auVar126 = *pauVar52;
              auVar113 = *pauVar52;
              auVar89 = *pauVar52;
              auVar88 = *pauVar52;
              local_248._0_4_ = (int)*(undefined8 *)*pauVar52;
              local_248._4_4_ = (undefined4)((ulong)*(undefined8 *)*pauVar52 >> 0x20);
              pauVar52 = (undefined1 (*) [16])((long)pvVar59 + lVar32 + 0x30);
              local_238 = *(ulong *)*pauVar52;
              uStack_230 = *(undefined8 *)(*pauVar52 + 8);
              auVar127 = *pauVar52;
              auVar114 = *pauVar52;
              auVar90 = *pauVar52;
              auVar105 = *pauVar52;
              auVar83 = *(undefined1 (*) [16])((long)pvVar59 + lVar32 + 0x40);
              pauVar52 = (undefined1 (*) [16])((long)pvVar59 + lVar32 + 0x50);
              auVar128 = *pauVar52;
              auVar120 = *pauVar52;
              auVar91 = *pauVar52;
              auVar115 = *pauVar52;
              pauVar52 = (undefined1 (*) [16])((long)pvVar59 + lVar32 + 0x60);
              auVar129 = *pauVar52;
              auVar121 = *pauVar52;
              auVar110 = *pauVar52;
              auVar108 = *pauVar52;
              auVar106 = *pauVar52;
              auVar92 = *pauVar52;
              auVar69 = *pauVar52;
              auVar67 = *pauVar52;
              auVar101 = *pauVar52;
              auVar85 = *pauVar52;
              auVar139 = *pauVar52;
              auVar116 = *pauVar52;
              auVar76 = *pauVar52;
              auVar117 = *pauVar52;
              pauVar52 = (undefined1 (*) [16])((long)pvVar59 + lVar32 + 0x70);
              auVar130 = *pauVar52;
              auVar123 = *pauVar52;
              auVar93 = *pauVar52;
              auVar119 = *pauVar52;
              auVar78 = *(undefined1 (*) [16])((long)pvVar59 + lVar32 + 0x80);
              ppp_Var37 = (_func_int ***)((long)ppp_Var38 + (long)local_298.w * local_298.elemsize);
              for (iVar40 = 0; iVar40 != (int)uVar63; iVar40 = iVar40 + 1) {
                pauVar52 = pauVar41 + 2;
                ppp_Var34 = ppp_Var37 + 4;
                ppp_Var57 = ppp_Var38 + 4;
                lVar32 = 0;
                for (iVar43 = 0; iVar43 + 7 < iVar28; iVar43 = iVar43 + 8) {
                  auVar23._8_8_ = uVar73;
                  auVar23._0_8_ = uVar66;
                  auVar131 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var38 + lVar32),
                                             auVar133,auVar23);
                  auVar4 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 2) + lVar32);
                  auVar5 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 4) + lVar32);
                  auVar6 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 6) + lVar32);
                  auVar131 = vfmadd231ps_fma(auVar131,auVar4,auVar74);
                  auVar131 = vfmadd231ps_fma(auVar131,auVar88,auVar5);
                  auVar134 = vfmadd231ps_fma(auVar131,auVar105,
                                             *(undefined1 (*) [16])((long)ppp_Var37 + lVar32));
                  auVar131 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var37 + 2) + lVar32);
                  auVar132 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var37 + 4) + lVar32);
                  auVar134 = vfmadd231ps_fma(auVar134,auVar83,auVar131);
                  auVar134 = vfmadd231ps_fma(auVar134,auVar115,auVar132);
                  auVar140 = vfmadd231ps_fma(auVar134,auVar117,
                                             *(undefined1 (*) [16])(*pauVar41 + lVar32));
                  auVar134 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var37 + 6) + lVar32);
                  auVar137 = *(undefined1 (*) [16])(pauVar41[1] + lVar32);
                  auVar138 = *(undefined1 (*) [16])(pauVar41[2] + lVar32);
                  auVar24 = *(undefined1 (*) [16])(pauVar41[3] + lVar32);
                  auVar140 = vfmadd231ps_fma(auVar140,auVar119,auVar137);
                  auVar140 = vfmadd231ps_fma(auVar140,auVar78,auVar138);
                  *(undefined1 (*) [16])(*pauVar51 + lVar32) = auVar140;
                  auVar4 = vfmadd213ps_fma(auVar4,auVar133,auVar23);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar75);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar88,auVar6);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar105,auVar131);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar132,auVar83);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar115,auVar134);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar137,auVar76);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar119,auVar138);
                  auVar137 = vfmadd231ps_fma(auVar4,auVar78,auVar24);
                  auVar4 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 8) + lVar32);
                  auVar131 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var37 + 8) + lVar32);
                  auVar143 = *(undefined1 (*) [16])(pauVar41[4] + lVar32);
                  auVar140 = *(undefined1 (*) [16])(pauVar41[4] + lVar32);
                  *(undefined1 (*) [16])(pauVar51[1] + lVar32) = auVar137;
                  auVar5 = vfmadd213ps_fma(auVar5,auVar133,auVar23);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar6,auVar104);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar88,auVar4);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar105,auVar132);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar134,auVar83);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar115,auVar131);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar138,auVar116);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar119,auVar24);
                  auVar138 = vfmadd231ps_fma(auVar5,auVar78,auVar140);
                  auVar5 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 10) + lVar32);
                  auVar132 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var37 + 10) + lVar32)
                  ;
                  auVar137 = *(undefined1 (*) [16])(pauVar41[5] + lVar32);
                  *(undefined1 (*) [16])(pauVar51[2] + lVar32) = auVar138;
                  auVar6 = vfmadd213ps_fma(auVar6,auVar133,auVar23);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar4,auVar118);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar88,auVar5);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar105,auVar134);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar131,auVar83);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar115,auVar132);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar24,auVar139);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar119,auVar140);
                  auVar138 = vfmadd231ps_fma(auVar6,auVar78,auVar137);
                  auVar6 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 0xc) + lVar32);
                  auVar134 = *(undefined1 (*) [16])
                              (*(undefined1 (*) [16])(ppp_Var37 + 0xc) + lVar32);
                  local_228 = *(undefined1 (*) [16])(pauVar41[6] + lVar32);
                  *(undefined1 (*) [16])(pauVar51[3] + lVar32) = auVar138;
                  auVar4 = vfmadd213ps_fma(auVar4,auVar133,auVar23);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar141);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar88,auVar6);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar105,auVar131);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar132,auVar83);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar115,auVar134);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar143,auVar85);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar119,auVar137);
                  auVar140 = vfmadd231ps_fma(auVar4,auVar78,local_228);
                  auVar4 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 0xe) + lVar32);
                  auVar131 = *(undefined1 (*) [16])
                              (*(undefined1 (*) [16])(ppp_Var37 + 0xe) + lVar32);
                  auVar138 = *(undefined1 (*) [16])(pauVar41[7] + lVar32);
                  *(undefined1 (*) [16])(pauVar51[4] + lVar32) = auVar140;
                  auVar5 = vfmadd213ps_fma(auVar5,auVar133,auVar23);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar6,auVar84);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar88,auVar4);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar105,auVar132);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar134,auVar83);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar115,auVar131);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar137,auVar101);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar119,local_228);
                  auVar140 = vfmadd231ps_fma(auVar5,auVar78,auVar138);
                  auVar5 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 0x10) + lVar32)
                  ;
                  auVar132 = *(undefined1 (*) [16])
                              (*(undefined1 (*) [16])(ppp_Var37 + 0x10) + lVar32);
                  auVar137 = *(undefined1 (*) [16])(pauVar41[8] + lVar32);
                  *(undefined1 (*) [16])(pauVar51[5] + lVar32) = auVar140;
                  auVar6 = vfmadd213ps_fma(auVar6,auVar133,auVar23);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar4,auVar22);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar88,auVar5);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar105,auVar134);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar83,auVar131);
                  auVar6 = vfmadd231ps_fma(auVar6,auVar115,auVar132);
                  auVar6 = vfmadd231ps_fma(auVar6,local_228,auVar67);
                  auVar4 = vfmadd213ps_fma(auVar4,auVar133,auVar23);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar68);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar88,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var38 + 0x12) + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar105,auVar131);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar83,auVar132);
                  auVar5 = vfmadd231ps_fma(auVar6,auVar119,auVar138);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar115,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var37 + 0x12) + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar138,auVar69);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar119,auVar137);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar78,
                                           *(undefined1 (*) [16])(pauVar41[9] + lVar32));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar78,auVar137);
                  *(undefined1 (*) [16])(pauVar51[6] + lVar32) = auVar5;
                  *(undefined1 (*) [16])(pauVar51[7] + lVar32) = auVar4;
                  lVar32 = lVar32 + 0x80;
                  pauVar52 = pauVar52 + 8;
                  ppp_Var34 = ppp_Var34 + 0x10;
                  ppp_Var57 = ppp_Var57 + 0x10;
                }
                for (; iVar43 + 3 < iVar28; iVar43 = iVar43 + 4) {
                  auVar4._8_8_ = uVar73;
                  auVar4._0_8_ = uVar66;
                  auVar131 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var38 + lVar32),
                                             auVar77,auVar4);
                  auVar4 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 2) + lVar32);
                  auVar5 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 4) + lVar32);
                  auVar6 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 6) + lVar32);
                  auVar131 = vfmadd231ps_fma(auVar131,auVar4,auVar79);
                  auVar131 = vfmadd231ps_fma(auVar131,auVar89,auVar5);
                  auVar134 = vfmadd231ps_fma(auVar131,auVar90,
                                             *(undefined1 (*) [16])((long)ppp_Var37 + lVar32));
                  auVar131 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var37 + 2) + lVar32);
                  auVar132 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var37 + 4) + lVar32);
                  auVar134 = vfmadd231ps_fma(auVar134,auVar83,auVar131);
                  auVar134 = vfmadd231ps_fma(auVar134,auVar91,auVar132);
                  auVar140 = vfmadd231ps_fma(auVar134,auVar92,
                                             *(undefined1 (*) [16])(*pauVar41 + lVar32));
                  auVar134 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var37 + 6) + lVar32);
                  auVar137 = *(undefined1 (*) [16])(pauVar41[1] + lVar32);
                  auVar138 = *(undefined1 (*) [16])(pauVar41[2] + lVar32);
                  local_228 = *(undefined1 (*) [16])(pauVar41[3] + lVar32);
                  auVar140 = vfmadd231ps_fma(auVar140,auVar93,auVar137);
                  auVar140 = vfmadd231ps_fma(auVar140,auVar78,auVar138);
                  *(undefined1 (*) [16])(*pauVar51 + lVar32) = auVar140;
                  auVar24._8_8_ = uVar73;
                  auVar24._0_8_ = uVar66;
                  auVar4 = vfmadd213ps_fma(auVar4,auVar77,auVar24);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar5,auVar94);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar89,auVar6);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar90,auVar131);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar132,auVar83);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar91,auVar134);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar137,auVar106);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar93,auVar138);
                  auVar140 = vfmadd231ps_fma(auVar4,auVar78,local_228);
                  auVar4 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var38 + 8) + lVar32);
                  auVar131 = *(undefined1 (*) [16])(*(undefined1 (*) [16])(ppp_Var37 + 8) + lVar32);
                  auVar137 = *(undefined1 (*) [16])(pauVar41[4] + lVar32);
                  *(undefined1 (*) [16])(pauVar51[1] + lVar32) = auVar140;
                  auVar5 = vfmadd213ps_fma(auVar5,auVar77,auVar24);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar6,auVar107);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar89,auVar4);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar90,auVar132);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar134,auVar83);
                  auVar5 = vfmadd231ps_fma(auVar5,auVar91,auVar131);
                  auVar132 = vfmadd231ps_fma(auVar5,auVar138,auVar108);
                  auVar5 = vfmadd213ps_fma(auVar6,auVar77,auVar24);
                  auVar4 = vfmadd231ps_fma(auVar5,auVar4,auVar109);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar89,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var38 + 10) + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar90,auVar134);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar131,auVar83);
                  auVar5 = vfmadd231ps_fma(auVar132,auVar93,local_228);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar91,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var37 + 10) + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,local_228,auVar110);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar93,auVar137);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar78,
                                           *(undefined1 (*) [16])(pauVar41[5] + lVar32));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar78,auVar137);
                  *(undefined1 (*) [16])(pauVar51[2] + lVar32) = auVar5;
                  *(undefined1 (*) [16])(pauVar51[3] + lVar32) = auVar4;
                  lVar32 = lVar32 + 0x40;
                  pauVar52 = pauVar52 + 4;
                  ppp_Var34 = ppp_Var34 + 8;
                  ppp_Var57 = ppp_Var57 + 8;
                }
                for (; iVar43 + 1 < iVar28; iVar43 = iVar43 + 2) {
                  auVar6._8_8_ = uVar73;
                  auVar6._0_8_ = uVar66;
                  auVar4 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var38 + lVar32),auVar111
                                           ,auVar6);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar112,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var38 + 2) + lVar32));
                  auVar5 = vfmadd231ps_fma(auVar4,auVar113,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var38 + 4) + lVar32));
                  auVar4 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var38 + 2) + lVar32),
                                           auVar111,auVar6);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar112,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var38 + 4) + lVar32));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar114,
                                           *(undefined1 (*) [16])((long)ppp_Var37 + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar113,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var38 + 6) + lVar32));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar83,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var37 + 2) + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar114,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var37 + 2) + lVar32));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar120,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var37 + 4) + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar83,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var37 + 4) + lVar32));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar121,
                                           *(undefined1 (*) [16])(*pauVar41 + lVar32));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar123,
                                           *(undefined1 (*) [16])(pauVar41[1] + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar120,
                                           *(undefined1 (*) [16])
                                            (*(undefined1 (*) [16])(ppp_Var37 + 6) + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar121,
                                           *(undefined1 (*) [16])(pauVar41[1] + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar123,
                                           *(undefined1 (*) [16])(pauVar41[2] + lVar32));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar78,
                                           *(undefined1 (*) [16])(pauVar41[3] + lVar32));
                  auVar5 = vfmadd231ps_fma(auVar5,auVar78,
                                           *(undefined1 (*) [16])(pauVar41[2] + lVar32));
                  *(undefined1 (*) [16])(*pauVar51 + lVar32) = auVar5;
                  *(undefined1 (*) [16])(pauVar51[1] + lVar32) = auVar4;
                  lVar32 = lVar32 + 0x20;
                  pauVar52 = pauVar52 + 2;
                  ppp_Var34 = ppp_Var34 + 4;
                  ppp_Var57 = ppp_Var57 + 4;
                }
                pauVar51 = (undefined1 (*) [16])(*pauVar51 + lVar32);
                pauVar41 = pauVar52;
                for (; iVar43 < iVar28; iVar43 = iVar43 + 1) {
                  auVar5._8_8_ = uVar73;
                  auVar5._0_8_ = uVar66;
                  auVar4 = vfmadd213ps_fma(*(undefined1 (*) [16])(ppp_Var57 + -4),auVar124,auVar5);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar125,*(undefined1 (*) [16])(ppp_Var57 + -2));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar126,*(undefined1 (*) [16])ppp_Var57);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar127,*(undefined1 (*) [16])(ppp_Var34 + -4));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar83,*(undefined1 (*) [16])(ppp_Var34 + -2));
                  auVar4 = vfmadd231ps_fma(auVar4,auVar128,*(undefined1 (*) [16])ppp_Var34);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar129,pauVar41[-2]);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar130,pauVar41[-1]);
                  auVar4 = vfmadd231ps_fma(auVar4,auVar78,*pauVar41);
                  *pauVar51 = auVar4;
                  pauVar51 = pauVar51 + 1;
                  pauVar41 = pauVar41 + 1;
                  ppp_Var34 = ppp_Var34 + 2;
                  ppp_Var57 = ppp_Var57 + 2;
                }
                ppp_Var37 = ppp_Var34;
                ppp_Var38 = ppp_Var57;
              }
            }
          }
          else {
            iVar61 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var35) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var35) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var35) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var35) != 2)) goto LAB_003e4230;
            iVar28 = top_blob->w;
            lVar49 = *(long *)(&this->field_0x1b0 + (long)p_Var35);
            uVar50 = 0;
            uVar63 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar63 = uVar50;
            }
            uVar39 = local_298.c;
            if (local_298.c < 1) {
              uVar39 = 0;
            }
            lVar32 = (long)((local_298.w - iVar28) * 8) * 4;
            for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar50 != uVar39;
                uVar50 = uVar50 + 1) {
              if (lVar49 == 0) {
                auVar83 = ZEXT816(0) << 0x40;
              }
              else {
                auVar83 = *(undefined1 (*) [16])(lVar49 + uVar50 * 0x10);
              }
              pauVar52 = (undefined1 (*) [16])
                         (top_blob->cstep * uVar50 * top_blob->elemsize + (long)top_blob->data);
              pvVar17 = (this->weight_data_tm).data;
              lVar48 = (long)(this->weight_data_tm).w * uVar50 * (this->weight_data_tm).elemsize;
              ppp_Var38 = (_func_int ***)
                          ((long)(_func_int ***)local_298.data +
                          local_298.cstep * uVar50 * local_298.elemsize);
              ppp_Var37 = (_func_int ***)((long)ppp_Var38 + (long)local_298.w * local_298.elemsize);
              pvVar59 = (void *)((long)ppp_Var38 + (long)local_298.w * local_298.elemsize * 2);
              auVar78 = *(undefined1 (*) [16])((long)pvVar17 + lVar48);
              auVar133 = *(undefined1 (*) [16])((long)pvVar17 + lVar48 + 0x10);
              auVar74 = *(undefined1 (*) [16])((long)pvVar17 + lVar48 + 0x20);
              auVar88 = *(undefined1 (*) [16])((long)pvVar17 + lVar48 + 0x30);
              auVar105 = *(undefined1 (*) [16])((long)pvVar17 + lVar48 + 0x40);
              auVar115 = *(undefined1 (*) [16])((long)pvVar17 + lVar48 + 0x50);
              auVar117 = *(undefined1 (*) [16])((long)pvVar17 + lVar48 + 0x60);
              auVar119 = *(undefined1 (*) [16])((long)pvVar17 + lVar48 + 0x70);
              auVar75 = *(undefined1 (*) [16])((long)pvVar17 + lVar48 + 0x80);
              for (iVar40 = 0; iVar40 != (int)uVar63; iVar40 = iVar40 + 1) {
                lVar48 = 0;
                for (iVar43 = 0; iVar43 + 3 < iVar28; iVar43 = iVar43 + 4) {
                  auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var38 + lVar48),auVar78
                                            ,auVar83);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar133,
                                            *(undefined1 (*) [16])((long)(ppp_Var38 + 2) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar74,
                                            *(undefined1 (*) [16])((long)(ppp_Var38 + 4) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar88,
                                            *(undefined1 (*) [16])((long)ppp_Var37 + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar105,
                                            *(undefined1 (*) [16])((long)(ppp_Var37 + 2) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar115,
                                            *(undefined1 (*) [16])((long)(ppp_Var37 + 4) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar117,
                                            *(undefined1 (*) [16])((long)pvVar59 + lVar48));
                  auVar118 = vfmadd231ps_fma(auVar76,auVar119,
                                             *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x10));
                  auVar76 = *(undefined1 (*) [16])((long)(ppp_Var38 + 8) + lVar48);
                  auVar104 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)(ppp_Var38 + 4) + lVar48),
                                             auVar78,auVar83);
                  auVar116 = vfmadd231ps_fma(auVar104,auVar133,
                                             *(undefined1 (*) [16])((long)(ppp_Var38 + 6) + lVar48))
                  ;
                  auVar104 = *(undefined1 (*) [16])((long)(ppp_Var37 + 8) + lVar48);
                  auVar116 = vfmadd231ps_fma(auVar116,auVar74,auVar76);
                  auVar139 = vfmadd231ps_fma(auVar116,auVar88,
                                             *(undefined1 (*) [16])((long)(ppp_Var37 + 4) + lVar48))
                  ;
                  auVar116 = *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x20);
                  auVar118 = vfmadd231ps_fma(auVar118,auVar75,auVar116);
                  auVar139 = vfmadd231ps_fma(auVar139,auVar105,
                                             *(undefined1 (*) [16])((long)(ppp_Var37 + 6) + lVar48))
                  ;
                  auVar139 = vfmadd231ps_fma(auVar139,auVar115,auVar104);
                  auVar139 = vfmadd231ps_fma(auVar139,auVar117,auVar116);
                  auVar116 = *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x40);
                  auVar139 = vfmadd231ps_fma(auVar139,auVar119,
                                             *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x30));
                  *pauVar52 = auVar118;
                  auVar139 = vfmadd231ps_fma(auVar139,auVar75,auVar116);
                  auVar118 = *(undefined1 (*) [16])((long)(ppp_Var38 + 0xc) + lVar48);
                  auVar76 = vfmadd213ps_fma(auVar76,auVar78,auVar83);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar133,
                                            *(undefined1 (*) [16])((long)(ppp_Var38 + 10) + lVar48))
                  ;
                  auVar76 = vfmadd231ps_fma(auVar76,auVar74,auVar118);
                  auVar104 = vfmadd231ps_fma(auVar76,auVar88,auVar104);
                  auVar76 = *(undefined1 (*) [16])((long)(ppp_Var37 + 0xc) + lVar48);
                  auVar104 = vfmadd231ps_fma(auVar104,auVar105,
                                             *(undefined1 (*) [16])((long)(ppp_Var37 + 10) + lVar48)
                                            );
                  auVar104 = vfmadd231ps_fma(auVar104,auVar115,auVar76);
                  auVar116 = vfmadd231ps_fma(auVar104,auVar117,auVar116);
                  auVar104 = *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x60);
                  auVar141 = vfmadd231ps_fma(auVar116,auVar119,
                                             *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x50));
                  pauVar52[1] = auVar139;
                  auVar116 = vfmadd213ps_fma(auVar118,auVar78,auVar83);
                  auVar116 = vfmadd231ps_fma(auVar116,auVar133,
                                             *(undefined1 (*) [16])
                                              ((long)(ppp_Var38 + 0xe) + lVar48));
                  auVar116 = vfmadd231ps_fma(auVar116,auVar74,
                                             *(undefined1 (*) [16])
                                              ((long)(ppp_Var38 + 0x10) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar116,auVar88,auVar76);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar105,
                                            *(undefined1 (*) [16])((long)(ppp_Var37 + 0xe) + lVar48)
                                           );
                  auVar76 = vfmadd231ps_fma(auVar76,auVar115,
                                            *(undefined1 (*) [16])
                                             ((long)(ppp_Var37 + 0x10) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar117,auVar104);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar119,
                                            *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x70));
                  auVar104 = vfmadd231ps_fma(auVar141,auVar75,auVar104);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar75,
                                            *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x80));
                  pauVar52[2] = auVar104;
                  pauVar52[3] = auVar76;
                  pauVar52 = pauVar52 + 4;
                  lVar48 = lVar48 + 0x80;
                }
                for (; iVar43 + 1 < iVar28; iVar43 = iVar43 + 2) {
                  auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var38 + lVar48),auVar78
                                            ,auVar83);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar133,
                                            *(undefined1 (*) [16])((long)(ppp_Var38 + 2) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar74,
                                            *(undefined1 (*) [16])((long)(ppp_Var38 + 4) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar88,
                                            *(undefined1 (*) [16])((long)ppp_Var37 + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar105,
                                            *(undefined1 (*) [16])((long)(ppp_Var37 + 2) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar115,
                                            *(undefined1 (*) [16])((long)(ppp_Var37 + 4) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar117,
                                            *(undefined1 (*) [16])((long)pvVar59 + lVar48));
                  auVar104 = vfmadd231ps_fma(auVar76,auVar119,
                                             *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x10));
                  auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)(ppp_Var38 + 4) + lVar48),
                                            auVar78,auVar83);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar133,
                                            *(undefined1 (*) [16])((long)(ppp_Var38 + 6) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar74,
                                            *(undefined1 (*) [16])((long)(ppp_Var38 + 8) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar88,
                                            *(undefined1 (*) [16])((long)(ppp_Var37 + 4) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar105,
                                            *(undefined1 (*) [16])((long)(ppp_Var37 + 6) + lVar48));
                  auVar116 = vfmadd231ps_fma(auVar76,auVar115,
                                             *(undefined1 (*) [16])((long)(ppp_Var37 + 8) + lVar48))
                  ;
                  auVar76 = *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x20);
                  auVar116 = vfmadd231ps_fma(auVar116,auVar117,auVar76);
                  auVar116 = vfmadd231ps_fma(auVar116,auVar119,
                                             *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x30));
                  auVar76 = vfmadd231ps_fma(auVar104,auVar75,auVar76);
                  auVar104 = vfmadd231ps_fma(auVar116,auVar75,
                                             *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x40));
                  *pauVar52 = auVar76;
                  pauVar52[1] = auVar104;
                  pauVar52 = pauVar52 + 2;
                  lVar48 = lVar48 + 0x40;
                }
                for (; iVar43 < iVar28; iVar43 = iVar43 + 1) {
                  auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)ppp_Var38 + lVar48),auVar78
                                            ,auVar83);
                  auVar76 = vfmadd231ps_fma(auVar76,auVar133,
                                            *(undefined1 (*) [16])((long)(ppp_Var38 + 2) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar74,
                                            *(undefined1 (*) [16])((long)(ppp_Var38 + 4) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar88,
                                            *(undefined1 (*) [16])((long)ppp_Var37 + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar105,
                                            *(undefined1 (*) [16])((long)(ppp_Var37 + 2) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar115,
                                            *(undefined1 (*) [16])((long)(ppp_Var37 + 4) + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar117,
                                            *(undefined1 (*) [16])((long)pvVar59 + lVar48));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar119,
                                            *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x10));
                  auVar76 = vfmadd231ps_fma(auVar76,auVar75,
                                            *(undefined1 (*) [16])((long)pvVar59 + lVar48 + 0x20));
                  *pauVar52 = auVar76;
                  pauVar52 = pauVar52 + 1;
                  lVar48 = lVar48 + 0x20;
                }
                ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar48 + lVar32);
                ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar48 + lVar32);
                pvVar59 = (void *)((long)pvVar59 + lVar48 + lVar32);
              }
            }
          }
          goto LAB_003e52dd;
        }
LAB_003e4230:
        uVar62 = iVar61 * iVar28;
        std::vector<int,_std::allocator<int>_>::vector
                  (&_space_ofs,(long)(int)uVar62,(allocator_type *)&opt_p);
        pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_fma;
        p_Var35 = pp_Var20[-3];
        iVar28 = *(int *)(&this->field_0xe0 + (long)p_Var35);
        iVar61 = *(int *)(&this->field_0xdc + (long)p_Var35);
        iVar14 = *(int *)(&this->field_0xd4 + (long)p_Var35);
        lVar49 = 0;
        iVar44 = 0;
        for (iVar47 = 0; iVar47 < *(int *)(&this->field_0xd8 + (long)p_Var35); iVar47 = iVar47 + 1)
        {
          for (lVar32 = 0; (int)lVar32 < *(int *)(&this->field_0xd4 + (long)p_Var35);
              lVar32 = lVar32 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar49 + lVar32] = iVar44;
            p_Var35 = pp_Var20[-3];
            iVar44 = iVar44 + *(int *)(&this->field_0xdc + (long)p_Var35);
          }
          iVar44 = iVar44 + (iVar26 * iVar28 - iVar61 * iVar14);
          lVar49 = (int)lVar49 + lVar32;
        }
        local_238 = CONCAT44(local_238._4_4_,uVar62 * 4);
        uVar50 = 0;
        uVar63 = (ulong)uVar62;
        if ((int)uVar62 < 1) {
          uVar63 = uVar50;
        }
        uVar31 = (ulong)uVar39;
        if ((int)uVar39 < 1) {
          uVar31 = uVar50;
        }
        auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar116._8_4_ = 0x3f000000;
        auVar116._0_8_ = 0x3f0000003f000000;
        auVar116._12_4_ = 0x3f000000;
        auVar141._8_4_ = 0x3f800000;
        auVar141._0_8_ = 0x3f8000003f800000;
        auVar141._12_4_ = 0x3f800000;
        auVar139._8_4_ = 0xc2b0c0a5;
        auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar139._12_4_ = 0xc2b0c0a5;
        auVar118._8_4_ = 0xb95e8083;
        auVar118._0_8_ = 0xb95e8083b95e8083;
        auVar118._12_4_ = 0xb95e8083;
        auVar104._8_4_ = 0x3ab743ce;
        auVar104._0_8_ = 0x3ab743ce3ab743ce;
        auVar104._12_4_ = 0x3ab743ce;
        for (uVar36 = 0; uVar36 != uVar31; uVar36 = uVar36 + 1) {
          local_2a8 = (int)uVar50;
          pvVar59 = (void *)(top_blob->cstep * uVar36 * top_blob->elemsize + (long)top_blob->data);
          local_248._0_4_ = (int)uVar36;
          local_248._4_4_ = (undefined4)(uVar36 >> 0x20);
          pvVar17 = (this->weight_data_tm).data;
          for (iVar28 = 0; iVar28 <= local_2e8; iVar28 = iVar28 + 1) {
            pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_fma;
            for (lVar49 = 0; lVar49 <= iVar40; lVar49 = lVar49 + 1) {
              p_Var35 = pp_Var20[-3];
              if (*(int *)(&this->field_0x100 + (long)p_Var35) == 0) {
                auVar83 = ZEXT816(0) << 0x40;
              }
              else {
                auVar83 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x1b0 + (long)p_Var35) + uVar36 * 0x10);
              }
              for (lVar32 = 0; uVar63 * 4 != lVar32; lVar32 = lVar32 + 4) {
                auVar83 = vfmadd231ps_fma(auVar83,*(undefined1 (*) [16])
                                                   ((long)pvVar17 + lVar32 * 4 + (long)local_2a8 * 4
                                                   ),
                                          *(undefined1 (*) [16])
                                           ((long)&((Allocator *)
                                                   ((long)local_298.data +
                                                   (long)*(int *)((long)_space_ofs.
                                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar32)
                                                  * 2 * 8))->_vptr_Allocator +
                                           (long)(*(int *)(&this->field_0xe4 + (long)p_Var35) *
                                                  (int)lVar49 * 4) * 4 +
                                           (long)iVar28 *
                                           (long)*(int *)(&this->field_0xe8 + (long)p_Var35) *
                                           (long)local_298.w * local_298.elemsize +
                                           local_298.cstep * uVar36 * local_298.elemsize));
              }
              auVar85 = auVar83;
              if (*(int *)(&this->field_0x110 + (long)p_Var35) - 1U < 6) {
                auVar78 = auVar72._0_16_;
                auVar85 = vmaxps_avx(auVar83,auVar78);
                switch(*(int *)(&this->field_0x110 + (long)p_Var35)) {
                case 2:
                  auVar83 = vminps_avx(auVar83,auVar78);
                  uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var35);
                  auVar142._4_4_ = uVar3;
                  auVar142._0_4_ = uVar3;
                  auVar142._8_4_ = uVar3;
                  auVar142._12_4_ = uVar3;
                  auVar85 = vfmadd231ps_fma(auVar85,auVar83,auVar142);
                  break;
                case 3:
                  uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var35);
                  auVar80._4_4_ = uVar3;
                  auVar80._0_4_ = uVar3;
                  auVar80._8_4_ = uVar3;
                  auVar80._12_4_ = uVar3;
                  uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var35))[1];
                  auVar146._4_4_ = uVar3;
                  auVar146._0_4_ = uVar3;
                  auVar146._8_4_ = uVar3;
                  auVar146._12_4_ = uVar3;
                  auVar83 = vmaxps_avx(auVar83,auVar80);
                  auVar85 = vminps_avx(auVar146,auVar83);
                  break;
                case 4:
                  auVar81._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
                  auVar81._8_4_ = -auVar83._8_4_;
                  auVar81._12_4_ = -auVar83._12_4_;
                  auVar95._8_4_ = 0x42b0c0a5;
                  auVar95._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar95._12_4_ = 0x42b0c0a5;
                  auVar83 = vminps_avx(auVar81,auVar95);
                  auVar96._8_4_ = 0xc2b0c0a5;
                  auVar96._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar96._12_4_ = 0xc2b0c0a5;
                  auVar133 = vmaxps_avx(auVar83,auVar96);
                  auVar122._8_4_ = 0x3fb8aa3b;
                  auVar122._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar122._12_4_ = 0x3fb8aa3b;
                  auVar83 = vfmadd213ps_fma(auVar122,auVar133,auVar116);
                  auVar147._0_4_ = (int)auVar83._0_4_;
                  auVar147._4_4_ = (int)auVar83._4_4_;
                  auVar147._8_4_ = (int)auVar83._8_4_;
                  auVar147._12_4_ = (int)auVar83._12_4_;
                  auVar78 = vcvtdq2ps_avx(auVar147);
                  auVar83 = vcmpps_avx(auVar83,auVar78,1);
                  auVar83 = vandps_avx(auVar83,auVar141);
                  auVar83 = vsubps_avx(auVar78,auVar83);
                  auVar97._8_4_ = 0x3f318000;
                  auVar97._0_8_ = 0x3f3180003f318000;
                  auVar97._12_4_ = 0x3f318000;
                  auVar78 = vfmsub231ps_fma(auVar133,auVar83,auVar97);
                  auVar98._8_4_ = 0x395e8083;
                  auVar98._0_8_ = 0x395e8083395e8083;
                  auVar98._12_4_ = 0x395e8083;
                  auVar133 = vfmsub231ps_fma(auVar78,auVar83,auVar98);
                  auVar148._0_4_ = auVar133._0_4_ * auVar133._0_4_;
                  auVar148._4_4_ = auVar133._4_4_ * auVar133._4_4_;
                  auVar148._8_4_ = auVar133._8_4_ * auVar133._8_4_;
                  auVar148._12_4_ = auVar133._12_4_ * auVar133._12_4_;
                  auVar135._8_4_ = 0x39506967;
                  auVar135._0_8_ = 0x3950696739506967;
                  auVar135._12_4_ = 0x39506967;
                  auVar99._8_4_ = 0x3ab743ce;
                  auVar99._0_8_ = 0x3ab743ce3ab743ce;
                  auVar99._12_4_ = 0x3ab743ce;
                  auVar78 = vfmadd213ps_fma(auVar135,auVar133,auVar99);
                  auVar100._8_4_ = 0x3c088908;
                  auVar100._0_8_ = 0x3c0889083c088908;
                  auVar100._12_4_ = 0x3c088908;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar133,auVar100);
                  auVar70._8_4_ = 0x3d2aa9c1;
                  auVar70._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar70._12_4_ = 0x3d2aa9c1;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar133,auVar70);
                  auVar71._8_4_ = 0x3e2aaaaa;
                  auVar71._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar71._12_4_ = 0x3e2aaaaa;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar133,auVar71);
                  auVar78 = vfmadd213ps_fma(auVar78,auVar133,auVar116);
                  auVar78 = vfmadd213ps_fma(auVar78,auVar148,auVar133);
                  auVar136._0_4_ = auVar78._0_4_ + 1.0;
                  auVar136._4_4_ = auVar78._4_4_ + 1.0;
                  auVar136._8_4_ = auVar78._8_4_ + 1.0;
                  auVar136._12_4_ = auVar78._12_4_ + 1.0;
                  auVar82._0_4_ = (int)auVar83._0_4_;
                  auVar82._4_4_ = (int)auVar83._4_4_;
                  auVar82._8_4_ = (int)auVar83._8_4_;
                  auVar82._12_4_ = (int)auVar83._12_4_;
                  auVar83 = vpslld_avx(auVar82,0x17);
                  auVar83 = vpaddd_avx(auVar141,auVar83);
                  auVar78 = vfmadd213ps_fma(auVar83,auVar136,auVar141);
                  auVar72 = ZEXT464(0) << 0x20;
                  auVar83 = vrcpps_avx(auVar78);
                  auVar78 = vfmsub213ps_fma(auVar78,auVar83,auVar141);
                  auVar85 = vfnmadd132ps_fma(auVar78,auVar83,auVar83);
                  break;
                case 5:
                  auVar137._8_4_ = 0x42b0c0a5;
                  auVar137._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar137._12_4_ = 0x42b0c0a5;
                  auVar78 = vminps_avx(auVar83,auVar137);
                  auVar74 = vmaxps_avx(auVar139,auVar78);
                  auVar140._8_4_ = 0x3fb8aa3b;
                  auVar140._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar140._12_4_ = 0x3fb8aa3b;
                  auVar78 = vfmadd213ps_fma(auVar140,auVar74,auVar116);
                  auVar143._0_4_ = (int)auVar78._0_4_;
                  auVar143._4_4_ = (int)auVar78._4_4_;
                  auVar143._8_4_ = (int)auVar78._8_4_;
                  auVar143._12_4_ = (int)auVar78._12_4_;
                  auVar133 = vcvtdq2ps_avx(auVar143);
                  auVar78 = vcmpps_avx(auVar78,auVar133,1);
                  auVar78 = vandps_avx(auVar78,auVar141);
                  auVar78 = vsubps_avx(auVar133,auVar78);
                  auVar138._8_4_ = 0x3f318000;
                  auVar138._0_8_ = 0x3f3180003f318000;
                  auVar138._12_4_ = 0x3f318000;
                  auVar133 = vfmsub231ps_fma(auVar74,auVar78,auVar138);
                  auVar74 = vfnmsub231ps_fma(auVar133,auVar78,auVar118);
                  auVar144._0_4_ = auVar74._0_4_ * auVar74._0_4_;
                  auVar144._4_4_ = auVar74._4_4_ * auVar74._4_4_;
                  auVar144._8_4_ = auVar74._8_4_ * auVar74._8_4_;
                  auVar144._12_4_ = auVar74._12_4_ * auVar74._12_4_;
                  auVar89._8_4_ = 0x39506967;
                  auVar89._0_8_ = 0x3950696739506967;
                  auVar89._12_4_ = 0x39506967;
                  auVar133 = vfmadd213ps_fma(auVar89,auVar74,auVar104);
                  auVar120._8_4_ = 0x3c088908;
                  auVar120._0_8_ = 0x3c0889083c088908;
                  auVar120._12_4_ = 0x3c088908;
                  auVar133 = vfmadd213ps_fma(auVar133,auVar74,auVar120);
                  auVar121._8_4_ = 0x3d2aa9c1;
                  auVar121._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar121._12_4_ = 0x3d2aa9c1;
                  auVar133 = vfmadd213ps_fma(auVar133,auVar74,auVar121);
                  auVar106._8_4_ = 0x3e2aaaaa;
                  auVar106._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar106._12_4_ = 0x3e2aaaaa;
                  auVar133 = vfmadd213ps_fma(auVar133,auVar74,auVar106);
                  auVar133 = vfmadd213ps_fma(auVar133,auVar74,auVar116);
                  auVar133 = vfmadd213ps_fma(auVar133,auVar144,auVar74);
                  auVar90._0_4_ = auVar133._0_4_ + 1.0;
                  auVar90._4_4_ = auVar133._4_4_ + 1.0;
                  auVar90._8_4_ = auVar133._8_4_ + 1.0;
                  auVar90._12_4_ = auVar133._12_4_ + 1.0;
                  auVar77._0_4_ = (int)auVar78._0_4_;
                  auVar77._4_4_ = (int)auVar78._4_4_;
                  auVar77._8_4_ = (int)auVar78._8_4_;
                  auVar77._12_4_ = (int)auVar78._12_4_;
                  auVar78 = vpslld_avx(auVar77,0x17);
                  auVar78 = vpaddd_avx(auVar141,auVar78);
                  auVar105 = vfmadd213ps_fma(auVar78,auVar90,auVar141);
                  auVar91._8_4_ = 0x800000;
                  auVar91._0_8_ = 0x80000000800000;
                  auVar91._12_4_ = 0x800000;
                  auVar78 = vmaxps_avx(auVar105,auVar91);
                  auVar133 = vpsrld_avx(auVar78,0x17);
                  auVar107._8_4_ = 0xffffff82;
                  auVar107._0_8_ = 0xffffff82ffffff82;
                  auVar107._12_4_ = 0xffffff82;
                  auVar133 = vpaddd_avx(auVar133,auVar107);
                  auVar108._8_4_ = 0x807fffff;
                  auVar108._0_8_ = 0x807fffff807fffff;
                  auVar108._12_4_ = 0x807fffff;
                  auVar78 = vandps_avx(auVar78,auVar108);
                  auVar88 = vorps_avx(auVar78,auVar116);
                  auVar74 = vcvtdq2ps_avx(auVar133);
                  auVar109._8_4_ = 0x3f3504f3;
                  auVar109._0_8_ = 0x3f3504f33f3504f3;
                  auVar109._12_4_ = 0x3f3504f3;
                  auVar133 = vcmpps_avx(auVar88,auVar109,1);
                  auVar78 = vandps_avx(auVar133,auVar88);
                  auVar92._0_4_ = auVar88._0_4_ + -1.0 + auVar78._0_4_;
                  auVar92._4_4_ = auVar88._4_4_ + -1.0 + auVar78._4_4_;
                  auVar92._8_4_ = auVar88._8_4_ + -1.0 + auVar78._8_4_;
                  auVar92._12_4_ = auVar88._12_4_ + -1.0 + auVar78._12_4_;
                  auVar78 = vandps_avx(auVar133,auVar141);
                  auVar133 = vsubps_avx(auVar74,auVar78);
                  auVar134._0_4_ = auVar92._0_4_ * auVar92._0_4_;
                  auVar134._4_4_ = auVar92._4_4_ * auVar92._4_4_;
                  auVar134._8_4_ = auVar92._8_4_ * auVar92._8_4_;
                  auVar134._12_4_ = auVar92._12_4_ * auVar92._12_4_;
                  auVar145._8_4_ = 0x3d9021bb;
                  auVar145._0_8_ = 0x3d9021bb3d9021bb;
                  auVar145._12_4_ = 0x3d9021bb;
                  auVar123._8_4_ = 0xbdebd1b8;
                  auVar123._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar123._12_4_ = 0xbdebd1b8;
                  auVar78 = vfmadd213ps_fma(auVar145,auVar92,auVar123);
                  auVar124._8_4_ = 0x3def251a;
                  auVar124._0_8_ = 0x3def251a3def251a;
                  auVar124._12_4_ = 0x3def251a;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar92,auVar124);
                  auVar125._8_4_ = 0xbdfe5d4f;
                  auVar125._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar125._12_4_ = 0xbdfe5d4f;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar92,auVar125);
                  auVar126._8_4_ = 0x3e11e9bf;
                  auVar126._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar126._12_4_ = 0x3e11e9bf;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar92,auVar126);
                  auVar127._8_4_ = 0xbe2aae50;
                  auVar127._0_8_ = 0xbe2aae50be2aae50;
                  auVar127._12_4_ = 0xbe2aae50;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar92,auVar127);
                  auVar128._8_4_ = 0x3e4cceac;
                  auVar128._0_8_ = 0x3e4cceac3e4cceac;
                  auVar128._12_4_ = 0x3e4cceac;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar92,auVar128);
                  auVar129._8_4_ = 0xbe7ffffc;
                  auVar129._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar129._12_4_ = 0xbe7ffffc;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar92,auVar129);
                  auVar130._8_4_ = 0x3eaaaaaa;
                  auVar130._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar130._12_4_ = 0x3eaaaaaa;
                  auVar78 = vfmadd213ps_fma(auVar78,auVar92,auVar130);
                  auVar131._0_4_ = auVar134._0_4_ * auVar92._0_4_ * auVar78._0_4_;
                  auVar131._4_4_ = auVar134._4_4_ * auVar92._4_4_ * auVar78._4_4_;
                  auVar131._8_4_ = auVar134._8_4_ * auVar92._8_4_ * auVar78._8_4_;
                  auVar131._12_4_ = auVar134._12_4_ * auVar92._12_4_ * auVar78._12_4_;
                  auVar78 = vfmadd231ps_fma(auVar131,auVar133,auVar118);
                  auVar74 = vfmsub231ps_fma(auVar78,auVar116,auVar134);
                  auVar22._12_4_ = 0;
                  auVar22._0_12_ = ZEXT412(0);
                  auVar72 = ZEXT1264(ZEXT412(0)) << 0x20;
                  auVar78 = vcmpps_avx(auVar105,auVar22 << 0x20,2);
                  auVar74 = vsubps_avx(auVar74,auVar92);
                  auVar133 = vfnmadd231ps_fma(auVar74,auVar138,auVar133);
                  auVar93._0_4_ = auVar133._0_4_ + auVar133._0_4_;
                  auVar93._4_4_ = auVar133._4_4_ + auVar133._4_4_;
                  auVar93._8_4_ = auVar133._8_4_ + auVar133._8_4_;
                  auVar93._12_4_ = auVar133._12_4_ + auVar133._12_4_;
                  auVar110._8_4_ = 0x7fffffff;
                  auVar110._0_8_ = 0x7fffffff7fffffff;
                  auVar110._12_4_ = 0x7fffffff;
                  auVar78 = vblendvps_avx(auVar93,auVar110,auVar78);
                  auVar94._8_4_ = 0x42b0c0a5;
                  auVar94._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar94._12_4_ = 0x42b0c0a5;
                  auVar78 = vminps_avx(auVar78,auVar94);
                  auVar74 = vmaxps_avx(auVar139,auVar78);
                  auVar78 = vfmadd213ps_fma(auVar140,auVar74,auVar116);
                  auVar111._0_4_ = (int)auVar78._0_4_;
                  auVar111._4_4_ = (int)auVar78._4_4_;
                  auVar111._8_4_ = (int)auVar78._8_4_;
                  auVar111._12_4_ = (int)auVar78._12_4_;
                  auVar133 = vcvtdq2ps_avx(auVar111);
                  auVar78 = vcmpps_avx(auVar78,auVar133,1);
                  auVar78 = vandps_avx(auVar141,auVar78);
                  auVar78 = vsubps_avx(auVar133,auVar78);
                  auVar133 = vfmsub231ps_fma(auVar74,auVar78,auVar138);
                  auVar74 = vfnmsub231ps_fma(auVar133,auVar78,auVar118);
                  auVar112._0_4_ = auVar74._0_4_ * auVar74._0_4_;
                  auVar112._4_4_ = auVar74._4_4_ * auVar74._4_4_;
                  auVar112._8_4_ = auVar74._8_4_ * auVar74._8_4_;
                  auVar112._12_4_ = auVar74._12_4_ * auVar74._12_4_;
                  auVar132._8_4_ = 0x39506967;
                  auVar132._0_8_ = 0x3950696739506967;
                  auVar132._12_4_ = 0x39506967;
                  auVar133 = vfmadd213ps_fma(auVar132,auVar74,auVar104);
                  auVar67._8_4_ = 0x3c088908;
                  auVar67._0_8_ = 0x3c0889083c088908;
                  auVar67._12_4_ = 0x3c088908;
                  auVar133 = vfmadd213ps_fma(auVar133,auVar74,auVar67);
                  auVar133 = vfmadd213ps_fma(auVar133,auVar74,auVar121);
                  auVar68._8_4_ = 0x3e2aaaaa;
                  auVar68._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar68._12_4_ = 0x3e2aaaaa;
                  auVar133 = vfmadd213ps_fma(auVar133,auVar74,auVar68);
                  auVar133 = vfmadd213ps_fma(auVar133,auVar74,auVar116);
                  auVar133 = vfmadd213ps_fma(auVar133,auVar112,auVar74);
                  auVar113._0_4_ = auVar133._0_4_ + 1.0;
                  auVar113._4_4_ = auVar133._4_4_ + 1.0;
                  auVar113._8_4_ = auVar133._8_4_ + 1.0;
                  auVar113._12_4_ = auVar133._12_4_ + 1.0;
                  auVar79._0_4_ = (int)auVar78._0_4_;
                  auVar79._4_4_ = (int)auVar78._4_4_;
                  auVar79._8_4_ = (int)auVar78._8_4_;
                  auVar79._12_4_ = (int)auVar78._12_4_;
                  auVar78 = vpslld_avx(auVar79,0x17);
                  auVar78 = vpaddd_avx(auVar141,auVar78);
                  auVar133 = vfmadd213ps_fma(auVar78,auVar113,auVar141);
                  auVar78 = vrcpps_avx(auVar133);
                  auVar114._0_4_ = auVar78._0_4_ + auVar78._0_4_;
                  auVar114._4_4_ = auVar78._4_4_ + auVar78._4_4_;
                  auVar114._8_4_ = auVar78._8_4_ + auVar78._8_4_;
                  auVar114._12_4_ = auVar78._12_4_ + auVar78._12_4_;
                  auVar69._8_4_ = 0x40000000;
                  auVar69._0_8_ = 0x4000000040000000;
                  auVar69._12_4_ = 0x40000000;
                  auVar133 = vfmsub213ps_fma(auVar133,auVar114,auVar69);
                  auVar78 = vfnmadd213ps_fma(auVar133,auVar78,auVar114);
                  auVar85 = vfmsub213ps_fma(auVar78,auVar83,auVar83);
                  break;
                case 6:
                  uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var35);
                  auVar84._4_4_ = uVar3;
                  auVar84._0_4_ = uVar3;
                  auVar84._8_4_ = uVar3;
                  auVar84._12_4_ = uVar3;
                  uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var35))[1];
                  auVar101._4_4_ = uVar3;
                  auVar101._0_4_ = uVar3;
                  auVar101._8_4_ = uVar3;
                  auVar101._12_4_ = uVar3;
                  auVar133 = vfmadd231ps_fma(auVar101,auVar83,auVar84);
                  auVar78 = vmaxps_avx(auVar78,auVar133);
                  auVar78 = vminps_avx(auVar141,auVar78);
                  auVar85._0_4_ = auVar83._0_4_ * auVar78._0_4_;
                  auVar85._4_4_ = auVar83._4_4_ * auVar78._4_4_;
                  auVar85._8_4_ = auVar83._8_4_ * auVar78._8_4_;
                  auVar85._12_4_ = auVar83._12_4_ * auVar78._12_4_;
                }
              }
              *(undefined1 (*) [16])((long)pvVar59 + lVar49 * 0x10) = auVar85;
            }
            pvVar59 = (void *)((long)pvVar59 + (long)(iVar43 * 4) * 4);
          }
          uVar50 = (ulong)(local_2a8 + uVar62 * 4);
        }
      }
      else {
        if (iVar28 != 8) goto LAB_003e3657;
        iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var35);
        iVar61 = *(int *)(&this->field_0xd8 + (long)p_Var35);
        if (iVar28 == 5) {
          if (iVar61 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var35) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var35) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var35) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var35) == 1)))) {
              uVar50 = 0;
              uVar63 = (ulong)(uint)top_blob->w;
              if (top_blob->w < 1) {
                uVar63 = uVar50;
              }
              lVar49 = *(long *)(&this->field_0x1b0 + (long)p_Var35);
              uVar31 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar31 = uVar50;
              }
              uVar36 = (ulong)(uint)local_298.c;
              if (local_298.c < 1) {
                uVar36 = uVar50;
              }
              for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar50 != uVar36;
                  uVar50 = uVar50 + 1) {
                if (lVar49 == 0) {
                  auVar87 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  auVar87 = *(undefined1 (*) [32])(lVar49 + uVar50 * 0x20);
                }
                pvVar33 = (void *)(top_blob->cstep * uVar50 * top_blob->elemsize +
                                  (long)top_blob->data);
                pvVar17 = (this->weight_data_tm).data;
                lVar48 = (long)(this->weight_data_tm).w * uVar50 * (this->weight_data_tm).elemsize;
                ppp_Var38 = (_func_int ***)
                            ((long)(_func_int ***)local_298.data +
                            local_298.cstep * uVar50 * local_298.elemsize);
                lVar32 = (long)local_298.w * local_298.elemsize;
                ppp_Var37 = (_func_int ***)((long)ppp_Var38 + lVar32);
                pvVar59 = (void *)((long)ppp_Var38 + lVar32 * 2);
                pvVar46 = (void *)((long)ppp_Var38 + lVar32 * 3);
                piVar42 = (pointer)((long)ppp_Var38 + lVar32 * 4);
                for (iVar28 = 0; iVar28 != (int)uVar31; iVar28 = iVar28 + 1) {
                  lVar32 = 0;
                  uVar30 = uVar63;
                  while (iVar40 = (int)uVar30, uVar30 = (ulong)(iVar40 - 1), iVar40 != 0) {
                    auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar48),auVar87
                                              ,*(undefined1 (*) [32])((long)ppp_Var38 + lVar32));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x20),
                                              *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar32)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x40),
                                              *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar32)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x60),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var38 + 0xc) + lVar32));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x80),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var38 + 0x10) + lVar32));
                    auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0xa0),
                                              ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)ppp_Var37 + lVar32));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0xc0),
                                              *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar32)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0xe0),
                                              *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar32)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x100)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var37 + 0xc) + lVar32));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x120)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var37 + 0x10) + lVar32));
                    auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x140)
                                              ,ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar59 + lVar32));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x160)
                                              ,*(undefined1 (*) [32])((long)pvVar59 + lVar32 + 0x20)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x180)
                                              ,*(undefined1 (*) [32])((long)pvVar59 + lVar32 + 0x40)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x1a0)
                                              ,*(undefined1 (*) [32])((long)pvVar59 + lVar32 + 0x60)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x1c0)
                                              ,*(undefined1 (*) [32])((long)pvVar59 + lVar32 + 0x80)
                                             );
                    auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x1e0)
                                              ,ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar46 + lVar32));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x200)
                                              ,*(undefined1 (*) [32])((long)pvVar46 + lVar32 + 0x20)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x220)
                                              ,*(undefined1 (*) [32])((long)pvVar46 + lVar32 + 0x40)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x240)
                                              ,*(undefined1 (*) [32])((long)pvVar46 + lVar32 + 0x60)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x260)
                                              ,*(undefined1 (*) [32])((long)pvVar46 + lVar32 + 0x80)
                                             );
                    auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x280)
                                              ,ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)piVar42 + lVar32));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x2a0)
                                              ,*(undefined1 (*) [32])((long)piVar42 + lVar32 + 0x20)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x2c0)
                                              ,*(undefined1 (*) [32])((long)piVar42 + lVar32 + 0x40)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x2e0)
                                              ,*(undefined1 (*) [32])((long)piVar42 + lVar32 + 0x60)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x300)
                                              ,*(undefined1 (*) [32])((long)piVar42 + lVar32 + 0x80)
                                             );
                    *(undefined1 (*) [32])((long)pvVar33 + lVar32) = ZEXT1632(auVar83);
                    lVar32 = lVar32 + 0x20;
                  }
                  ppp_Var38 = (_func_int ***)((long)(ppp_Var38 + 0x10) + lVar32);
                  ppp_Var37 = (_func_int ***)((long)(ppp_Var37 + 0x10) + lVar32);
                  pvVar59 = (void *)((long)pvVar59 + lVar32 + 0x80);
                  pvVar46 = (void *)((long)pvVar46 + lVar32 + 0x80);
                  piVar42 = (pointer)((long)piVar42 + lVar32 + 0x80);
                  pvVar33 = (void *)((long)pvVar33 + lVar32);
                }
              }
            }
            else {
              iVar61 = 5;
              if (((*(int *)(&this->field_0xdc + (long)p_Var35) != 1) ||
                  (*(int *)(&this->field_0xe0 + (long)p_Var35) != 1)) ||
                 ((*(int *)(&this->field_0xe4 + (long)p_Var35) != 2 ||
                  (*(int *)(&this->field_0xe8 + (long)p_Var35) != 2)))) goto LAB_003e4f80;
              iVar28 = top_blob->w;
              iVar40 = local_298.w - iVar28;
              lVar49 = *(long *)(&this->field_0x1b0 + (long)p_Var35);
              uVar63 = 0;
              if (iVar28 < 1) {
                iVar28 = 0;
              }
              uVar50 = (ulong)(uint)top_blob->h;
              if (top_blob->h < 1) {
                uVar50 = uVar63;
              }
              uVar31 = (ulong)(uint)local_298.c;
              if (local_298.c < 1) {
                uVar31 = uVar63;
              }
              lVar32 = (long)(iVar40 * 0x10) * 4;
              for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar63 != uVar31;
                  uVar63 = uVar63 + 1) {
                if (lVar49 == 0) {
                  auVar87 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  auVar87 = *(undefined1 (*) [32])(lVar49 + uVar63 * 0x20);
                }
                pauVar53 = (undefined1 (*) [32])
                           (top_blob->cstep * uVar63 * top_blob->elemsize + (long)top_blob->data);
                pvVar17 = (this->weight_data_tm).data;
                lVar45 = (long)(this->weight_data_tm).w * uVar63 * (this->weight_data_tm).elemsize;
                ppp_Var38 = (_func_int ***)
                            ((long)(_func_int ***)local_298.data +
                            local_298.cstep * uVar63 * local_298.elemsize);
                lVar48 = (long)local_298.w * local_298.elemsize;
                ppp_Var37 = (_func_int ***)((long)ppp_Var38 + lVar48);
                pvVar59 = (void *)((long)ppp_Var38 + lVar48 * 2);
                pvVar33 = (void *)((long)ppp_Var38 + lVar48 * 3);
                piVar42 = (pointer)((long)ppp_Var38 + lVar48 * 4);
                for (iVar40 = 0; iVar40 != (int)uVar50; iVar40 = iVar40 + 1) {
                  lVar48 = 0;
                  iVar43 = iVar28;
                  while (bVar64 = iVar43 != 0, iVar43 = iVar43 + -1, bVar64) {
                    auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar45),auVar87
                                              ,*(undefined1 (*) [32])((long)ppp_Var38 + lVar48));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x20),
                                              *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar48)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x40),
                                              *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar48)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x60),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var38 + 0xc) + lVar48));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x80),
                                              *(undefined1 (*) [32])
                                               ((long)(ppp_Var38 + 0x10) + lVar48));
                    auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0xa0),
                                              ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)ppp_Var37 + lVar48));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0xc0),
                                              *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar48)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0xe0),
                                              *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar48)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x100)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var37 + 0xc) + lVar48));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x120)
                                              ,*(undefined1 (*) [32])
                                                ((long)(ppp_Var37 + 0x10) + lVar48));
                    auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x140)
                                              ,ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar59 + lVar48));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x160)
                                              ,*(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x20)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x180)
                                              ,*(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x40)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x1a0)
                                              ,*(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x60)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x1c0)
                                              ,*(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x80)
                                             );
                    auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x1e0)
                                              ,ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar33 + lVar48));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x200)
                                              ,*(undefined1 (*) [32])((long)pvVar33 + lVar48 + 0x20)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x220)
                                              ,*(undefined1 (*) [32])((long)pvVar33 + lVar48 + 0x40)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x240)
                                              ,*(undefined1 (*) [32])((long)pvVar33 + lVar48 + 0x60)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x260)
                                              ,*(undefined1 (*) [32])((long)pvVar33 + lVar48 + 0x80)
                                             );
                    auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x280)
                                              ,ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)piVar42 + lVar48));
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x2a0)
                                              ,*(undefined1 (*) [32])((long)piVar42 + lVar48 + 0x20)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x2c0)
                                              ,*(undefined1 (*) [32])((long)piVar42 + lVar48 + 0x40)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x2e0)
                                              ,*(undefined1 (*) [32])((long)piVar42 + lVar48 + 0x60)
                                             );
                    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                              *(undefined1 (*) [32])((long)pvVar17 + lVar45 + 0x300)
                                              ,*(undefined1 (*) [32])((long)piVar42 + lVar48 + 0x80)
                                             );
                    *pauVar53 = ZEXT1632(auVar83);
                    pauVar53 = pauVar53 + 1;
                    lVar48 = lVar48 + 0x40;
                  }
                  ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar48 + lVar32);
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar48 + lVar32);
                  pvVar59 = (void *)((long)pvVar59 + lVar48 + lVar32);
                  pvVar33 = (void *)((long)pvVar33 + lVar48 + lVar32);
                  piVar42 = (pointer)((long)piVar42 + lVar48 + lVar32);
                }
              }
            }
            goto LAB_003e52dd;
          }
        }
        else if ((iVar28 == 3) && (iVar61 == 3)) {
          if ((*(int *)(&this->field_0xdc + (long)p_Var35) == 1) &&
             (((*(int *)(&this->field_0xe0 + (long)p_Var35) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var35) == 1)) &&
              (*(int *)(&this->field_0xe8 + (long)p_Var35) == 1)))) {
            iVar28 = top_blob->w;
            iVar40 = top_blob->h;
            lVar49 = *(long *)(&this->field_0x1b0 + (long)p_Var35);
            uVar50 = 0;
            uVar63 = (ulong)(uint)local_298.c;
            if (local_298.c < 1) {
              uVar63 = uVar50;
            }
            lVar48 = (long)(local_298.w * 8 + 0x10) * 4;
            lVar32 = (long)(iVar28 * 8) * 4;
            for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar50 != uVar63;
                uVar50 = uVar50 + 1) {
              if (lVar49 == 0) {
                auVar87 = ZEXT1632(ZEXT816(0) << 0x40);
              }
              else {
                auVar87 = *(undefined1 (*) [32])(lVar49 + uVar50 * 0x20);
              }
              pvVar54 = (void *)(top_blob->cstep * uVar50 * top_blob->elemsize +
                                (long)top_blob->data);
              lVar56 = (long)(this->weight_data_tm).w * uVar50 * (this->weight_data_tm).elemsize;
              pvVar17 = (this->weight_data_tm).data;
              pvVar33 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar54);
              ppp_Var38 = (_func_int ***)
                          ((long)(_func_int ***)local_298.data +
                          local_298.cstep * uVar50 * local_298.elemsize);
              lVar45 = (long)local_298.w * local_298.elemsize;
              ppp_Var37 = (_func_int ***)((long)ppp_Var38 + lVar45);
              pvVar59 = (void *)((long)ppp_Var38 + lVar45 * 2);
              pvVar46 = (void *)((long)ppp_Var38 + lVar45 * 3);
              for (uVar39 = 0; (int)(uVar39 | 1) < iVar40; uVar39 = uVar39 + 2) {
                lVar45 = 0;
                for (iVar43 = 0; iVar43 + 3 < iVar28; iVar43 = iVar43 + 4) {
                  auVar7 = *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar45);
                  auVar103 = *(undefined1 (*) [32])((long)(ppp_Var38 + 0xc) + lVar45);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar56);
                  auVar86 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x20);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x40);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x60);
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var38 + lVar45),auVar8,
                                            auVar87);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar45));
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar45),
                                            auVar8,auVar87);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,auVar7);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,auVar7);
                  auVar83 = vfmadd213ps_fma(auVar7,auVar8,auVar87);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,auVar103);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar102,auVar103);
                  auVar83 = vfmadd213ps_fma(auVar103,auVar8,auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x10) + lVar45));
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x10) + lVar45));
                  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x14) + lVar45));
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x80);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xa0);
                  auVar10 = *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar45);
                  auVar11 = *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar45);
                  auVar12 = *(undefined1 (*) [32])((long)(ppp_Var37 + 0xc) + lVar45);
                  auVar13 = *(undefined1 (*) [32])((long)(ppp_Var37 + 0x10) + lVar45);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar9,
                                            *(undefined1 (*) [32])((long)ppp_Var37 + lVar45));
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var37 + lVar45),auVar8,
                                            auVar87);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar9,auVar10);
                  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,auVar10);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar7,auVar10);
                  auVar83 = vfmadd213ps_fma(auVar10,auVar8,auVar87);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar9,auVar11);
                  auVar115 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,auVar11);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar7,auVar11);
                  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar102,auVar11);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar103,auVar11);
                  auVar83 = vfmadd213ps_fma(auVar11,auVar8,auVar87);
                  auVar78 = vfmadd213ps_fma(auVar8,auVar12,auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,auVar12);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar13,auVar86);
                  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar9,auVar12);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar7,auVar12);
                  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar7,auVar13);
                  auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar102,auVar12);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,auVar13);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x14) + lVar45),auVar102);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar103,auVar12);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar103,auVar13);
                  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar103,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x14) + lVar45));
                  auVar8 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x20);
                  auVar86 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x40);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x60);
                  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar9,
                                             *(undefined1 (*) [32])((long)pvVar59 + lVar45));
                  auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar9,auVar8);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar9,auVar86);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,auVar9);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xc0);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar9,
                                             *(undefined1 (*) [32])((long)pvVar59 + lVar45));
                  auVar10 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x80);
                  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar7,auVar8);
                  auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar7,auVar86);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,auVar102);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar10,auVar7);
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xe0);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar9,auVar8);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar7,auVar8);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0xa0);
                  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar103,auVar86);
                  auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar103,auVar102);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,auVar10);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar8,auVar103);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x100);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar9,auVar86);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar7,auVar86);
                  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar103,auVar86);
                  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar9,auVar102);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar7,auVar102);
                  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar7,auVar10);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar103,auVar102);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar103,auVar10);
                  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar103,auVar8);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar46 + lVar45 + 0x20);
                  auVar86 = *(undefined1 (*) [32])((long)pvVar46 + lVar45 + 0x40);
                  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar9,
                                             *(undefined1 (*) [32])((long)pvVar46 + lVar45));
                  auVar102 = *(undefined1 (*) [32])((long)pvVar46 + lVar45 + 0x60);
                  auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar9,auVar8);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar9,auVar86);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,auVar9);
                  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar7,auVar8);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar46 + lVar45 + 0x80);
                  auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar7,auVar86);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,auVar102);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar8,auVar7);
                  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar103,auVar86);
                  auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar103,auVar102);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,auVar8);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar103,
                                            *(undefined1 (*) [32])((long)pvVar46 + lVar45 + 0xa0));
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45) = ZEXT1632(auVar117);
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45 + 0x20) = ZEXT1632(auVar133);
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45 + 0x40) = ZEXT1632(auVar74);
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45 + 0x60) = ZEXT1632(auVar88);
                  *(undefined1 (*) [32])((long)pvVar33 + lVar45) = ZEXT1632(auVar105);
                  *(undefined1 (*) [32])((long)pvVar33 + lVar45 + 0x20) = ZEXT1632(auVar115);
                  *(undefined1 (*) [32])((long)pvVar33 + lVar45 + 0x40) = ZEXT1632(auVar83);
                  *(undefined1 (*) [32])((long)pvVar33 + lVar45 + 0x60) = ZEXT1632(auVar78);
                  lVar45 = lVar45 + 0x80;
                }
                for (; iVar43 + 1 < iVar28; iVar43 = iVar43 + 2) {
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x20);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x40);
                  auVar86 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x60);
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var38 + lVar45),auVar7,
                                            auVar87);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar45));
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar45),
                                            auVar7,auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar8,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 0xc) + lVar45)
                                           );
                  auVar102 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x80);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xa0);
                  auVar10 = *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar45);
                  auVar11 = *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar45);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar86,
                                             *(undefined1 (*) [32])((long)ppp_Var37 + lVar45));
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,auVar10);
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var37 + lVar45),auVar7,
                                            auVar87);
                  auVar78 = vfmadd213ps_fma(auVar7,auVar10,auVar87);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar102,auVar10);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar102,auVar11);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,auVar10);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar11,auVar103);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar9,auVar11);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar9,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 0xc) + lVar45)
                                           );
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,auVar11);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar8,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 0xc) + lVar45)
                                           );
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xc0);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xe0);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x100);
                  auVar10 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x20);
                  auVar11 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x40);
                  auVar12 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x60);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar7,
                                             *(undefined1 (*) [32])((long)pvVar59 + lVar45));
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar7,auVar10);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar10,auVar86);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar103,auVar10);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar103,auVar11);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,auVar10);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar11,auVar102);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar8,auVar11);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar8,auVar12);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar9,auVar11);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar9,auVar12);
                  auVar86 = *(undefined1 (*) [32])((long)pvVar46 + lVar45 + 0x20);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar46 + lVar45 + 0x40);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,
                                            *(undefined1 (*) [32])((long)pvVar46 + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar86,auVar7);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,auVar86);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,auVar103);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,auVar102);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar8,
                                            *(undefined1 (*) [32])((long)pvVar46 + lVar45 + 0x60));
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45) = ZEXT1632(auVar133);
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45 + 0x20) = ZEXT1632(auVar74);
                  *(undefined1 (*) [32])((long)pvVar33 + lVar45) = ZEXT1632(auVar83);
                  *(undefined1 (*) [32])((long)pvVar33 + lVar45 + 0x20) = ZEXT1632(auVar78);
                  lVar45 = lVar45 + 0x40;
                }
                for (; iVar43 < iVar28; iVar43 = iVar43 + 1) {
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x20);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x40);
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var38 + lVar45),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar56),auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar45));
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x60);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar45));
                  auVar86 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x80);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xa0);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,
                                            *(undefined1 (*) [32])((long)ppp_Var37 + lVar45));
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var37 + lVar45),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar56),auVar87);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar86,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar45));
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xc0);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xe0);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x100);
                  auVar10 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x20);
                  auVar11 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x40);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar7,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar103,auVar10);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,auVar10);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar9,auVar11);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,auVar11);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,
                                            *(undefined1 (*) [32])((long)pvVar46 + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)pvVar46 + lVar45 + 0x20));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar9,
                                            *(undefined1 (*) [32])((long)pvVar46 + lVar45 + 0x40));
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45) = ZEXT1632(auVar78);
                  *(undefined1 (*) [32])((long)pvVar33 + lVar45) = ZEXT1632(auVar83);
                  lVar45 = lVar45 + 0x20;
                }
                ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar45 + lVar48);
                ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar45 + lVar48);
                pvVar59 = (void *)((long)pvVar59 + lVar45 + lVar48);
                pvVar46 = (void *)((long)pvVar46 + lVar45 + lVar48);
                pvVar54 = (void *)((long)pvVar54 + lVar45 + lVar32);
                pvVar33 = (void *)((long)pvVar33 + lVar45 + lVar32);
              }
              for (; (int)uVar39 < iVar40; uVar39 = uVar39 + 1) {
                lVar45 = 0;
                for (iVar43 = 0; iVar43 + 3 < iVar28; iVar43 = iVar43 + 4) {
                  auVar7 = *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar45);
                  auVar103 = *(undefined1 (*) [32])((long)(ppp_Var38 + 0xc) + lVar45);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar56);
                  auVar86 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x20);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x40);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x60);
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var38 + lVar45),auVar8,
                                            auVar87);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar45));
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar45),
                                            auVar8,auVar87);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,auVar7);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,auVar7);
                  auVar83 = vfmadd213ps_fma(auVar7,auVar8,auVar87);
                  auVar78 = vfmadd213ps_fma(auVar8,auVar103,auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,auVar103);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x10) + lVar45),auVar86);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar102,auVar103);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x14) + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x10) + lVar45));
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x80);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xa0);
                  auVar8 = *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar45);
                  auVar86 = *(undefined1 (*) [32])((long)(ppp_Var37 + 0xc) + lVar45);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar9,
                                            *(undefined1 (*) [32])((long)ppp_Var37 + lVar45));
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar9,
                                             *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar45))
                  ;
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar9,auVar8);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar86,auVar9);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar7,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar45));
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar7,auVar8);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,auVar86);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x10) + lVar45),auVar7);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar103,auVar8);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar103,auVar86);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar103,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x14) + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x10) + lVar45));
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xc0);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xe0);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x100);
                  auVar86 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x20);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x40);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x60);
                  auVar10 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x80);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar7,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar45));
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar7,auVar86);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,auVar102);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar9,auVar7);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar103,auVar86);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar103,auVar102);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,auVar9);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar10,auVar103);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar8,auVar102);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar8,auVar9);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,auVar10);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar8,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0xa0));
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45) = ZEXT1632(auVar74);
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45 + 0x20) = ZEXT1632(auVar133);
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45 + 0x40) = ZEXT1632(auVar83);
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45 + 0x60) = ZEXT1632(auVar78);
                  lVar45 = lVar45 + 0x80;
                }
                for (; iVar43 + 1 < iVar28; iVar43 = iVar43 + 2) {
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x20);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x40);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x60);
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var38 + lVar45),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar56),auVar87);
                  auVar78 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar56),
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar45),
                                            auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar45),
                                            auVar7);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 0xc) + lVar45)
                                           );
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x80);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xa0);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,
                                            *(undefined1 (*) [32])((long)ppp_Var37 + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar45),
                                            auVar8);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar45),
                                            auVar7);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 0xc) + lVar45)
                                           );
                  auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xc0);
                  auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xe0);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x100);
                  auVar86 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x20);
                  auVar102 = *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x40);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar7,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar45));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar86,auVar7);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,auVar86);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,auVar103);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,auVar102);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar8,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x60));
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45) = ZEXT1632(auVar83);
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45 + 0x20) = ZEXT1632(auVar78);
                  lVar45 = lVar45 + 0x40;
                }
                for (; iVar43 < iVar28; iVar43 = iVar43 + 1) {
                  auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar56),auVar87,
                                            *(undefined1 (*) [32])((long)ppp_Var38 + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x20),
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x40),
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x60),
                                            *(undefined1 (*) [32])((long)ppp_Var37 + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x80),
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xa0),
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar45));
                  auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xc0),
                                            ZEXT1632(auVar83),
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar45));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0xe0),
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x20));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),
                                            *(undefined1 (*) [32])((long)pvVar17 + lVar56 + 0x100),
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar45 + 0x40));
                  *(undefined1 (*) [32])((long)pvVar54 + lVar45) = ZEXT1632(auVar83);
                  lVar45 = lVar45 + 0x20;
                }
                ppp_Var38 = (_func_int ***)((long)(ppp_Var38 + 8) + lVar45);
                ppp_Var37 = (_func_int ***)((long)(ppp_Var37 + 8) + lVar45);
                pvVar59 = (void *)((long)pvVar59 + lVar45 + 0x40);
                pvVar54 = (void *)((long)pvVar54 + lVar45);
              }
            }
          }
          else {
            iVar61 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var35) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var35) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var35) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var35) != 2)) goto LAB_003e4f80;
            iVar28 = top_blob->w;
            lVar49 = *(long *)(&this->field_0x1b0 + (long)p_Var35);
            uVar50 = 0;
            uVar63 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar63 = uVar50;
            }
            uVar39 = local_298.c;
            if (local_298.c < 1) {
              uVar39 = 0;
            }
            lVar32 = (long)((local_298.w - iVar28) * 0x10) * 4;
            for (; local_248 = CONCAT44(local_248._4_4_,(int)local_248), uVar50 != uVar39;
                uVar50 = uVar50 + 1) {
              if (lVar49 == 0) {
                auVar87 = ZEXT1632(ZEXT816(0) << 0x40);
              }
              else {
                auVar87 = *(undefined1 (*) [32])(lVar49 + uVar50 * 0x20);
              }
              pauVar53 = (undefined1 (*) [32])
                         (top_blob->cstep * uVar50 * top_blob->elemsize + (long)top_blob->data);
              pvVar17 = (this->weight_data_tm).data;
              lVar48 = (long)(this->weight_data_tm).w * uVar50 * (this->weight_data_tm).elemsize;
              ppp_Var38 = (_func_int ***)
                          ((long)(_func_int ***)local_298.data +
                          local_298.cstep * uVar50 * local_298.elemsize);
              ppp_Var37 = (_func_int ***)((long)ppp_Var38 + (long)local_298.w * local_298.elemsize);
              pvVar59 = (void *)((long)ppp_Var38 + (long)local_298.w * local_298.elemsize * 2);
              auVar7 = *(undefined1 (*) [32])((long)pvVar17 + lVar48);
              auVar103 = *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x20);
              auVar8 = *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x40);
              auVar86 = *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x60);
              auVar102 = *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x80);
              auVar9 = *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0xa0);
              auVar10 = *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0xc0);
              auVar11 = *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0xe0);
              auVar12 = *(undefined1 (*) [32])((long)pvVar17 + lVar48 + 0x100);
              for (iVar40 = 0; iVar40 != (int)uVar63; iVar40 = iVar40 + 1) {
                lVar48 = 0;
                for (iVar43 = 0; iVar43 + 3 < iVar28; iVar43 = iVar43 + 4) {
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var38 + lVar48),auVar7,
                                            auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar48));
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,
                                             *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar48))
                  ;
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar48),
                                            auVar7,auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 0xc) + lVar48)
                                           );
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x10) + lVar48));
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x10) + lVar48),auVar7,auVar87);
                  auVar78 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x18) + lVar48),auVar7,auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x14) + lVar48));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar103,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x1c) + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x18) + lVar48));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar8,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x20) + lVar48));
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar86,
                                             *(undefined1 (*) [32])((long)ppp_Var37 + lVar48));
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar86,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar48));
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar102,
                                             *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar48))
                  ;
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar9,
                                             *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar48))
                  ;
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x10) + lVar48));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar86,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x18) + lVar48));
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 0xc) + lVar48)
                                           );
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x14) + lVar48));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x1c) + lVar48));
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar9,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x10) + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar9,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x18) + lVar48));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar9,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x20) + lVar48));
                  auVar13 = *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x40);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar10,
                                             *(undefined1 (*) [32])((long)pvVar59 + lVar48));
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar10,auVar13);
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar11,
                                             *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x20));
                  auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar12,auVar13);
                  auVar13 = *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x80);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar10,auVar13);
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x60));
                  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar12,auVar13);
                  auVar13 = *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0xc0);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar10,auVar13);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0xa0));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0xe0));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar12,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x100));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar12,auVar13);
                  *pauVar53 = ZEXT1632(auVar133);
                  pauVar53[1] = ZEXT1632(auVar74);
                  pauVar53[2] = ZEXT1632(auVar83);
                  pauVar53[3] = ZEXT1632(auVar78);
                  pauVar53 = pauVar53 + 4;
                  lVar48 = lVar48 + 0x100;
                }
                for (; iVar43 + 1 < iVar28; iVar43 = iVar43 + 2) {
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var38 + lVar48),auVar7,
                                            auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar48));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar48));
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar48),
                                            auVar7,auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 0xc) + lVar48)
                                           );
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var38 + 0x10) + lVar48));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar86,
                                            *(undefined1 (*) [32])((long)ppp_Var37 + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar48));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 0xc) + lVar48)
                                           );
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar9,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar9,
                                            *(undefined1 (*) [32])
                                             ((long)(ppp_Var37 + 0x10) + lVar48));
                  auVar13 = *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x40);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar10,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar10,auVar13);
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x20));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x60));
                  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar12,auVar13);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar12,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x80));
                  *pauVar53 = ZEXT1632(auVar78);
                  pauVar53[1] = ZEXT1632(auVar83);
                  pauVar53 = pauVar53 + 2;
                  lVar48 = lVar48 + 0x80;
                }
                for (; iVar43 < iVar28; iVar43 = iVar43 + 1) {
                  auVar83 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)ppp_Var38 + lVar48),auVar7,
                                            auVar87);
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 4) + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar8,
                                            *(undefined1 (*) [32])((long)(ppp_Var38 + 8) + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar86,
                                            *(undefined1 (*) [32])((long)ppp_Var37 + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 4) + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar9,
                                            *(undefined1 (*) [32])((long)(ppp_Var37 + 8) + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar10,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar11,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x20));
                  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar12,
                                            *(undefined1 (*) [32])((long)pvVar59 + lVar48 + 0x40));
                  *pauVar53 = ZEXT1632(auVar83);
                  pauVar53 = pauVar53 + 1;
                  lVar48 = lVar48 + 0x40;
                }
                ppp_Var38 = (_func_int ***)((long)ppp_Var38 + lVar48 + lVar32);
                ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar48 + lVar32);
                pvVar59 = (void *)((long)pvVar59 + lVar48 + lVar32);
              }
            }
          }
          goto LAB_003e52dd;
        }
LAB_003e4f80:
        uVar62 = iVar61 * iVar28;
        std::vector<int,_std::allocator<int>_>::vector
                  (&_space_ofs,(long)(int)uVar62,(allocator_type *)&opt_p);
        pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_fma;
        p_Var35 = pp_Var20[-3];
        iVar28 = *(int *)(&this->field_0xe0 + (long)p_Var35);
        iVar61 = *(int *)(&this->field_0xdc + (long)p_Var35);
        iVar14 = *(int *)(&this->field_0xd4 + (long)p_Var35);
        iVar47 = 0;
        lVar49 = 0;
        for (iVar44 = 0; iVar44 < *(int *)(&this->field_0xd8 + (long)p_Var35); iVar44 = iVar44 + 1)
        {
          for (lVar32 = 0; (int)lVar32 < *(int *)(&this->field_0xd4 + (long)p_Var35);
              lVar32 = lVar32 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar49 + lVar32] = iVar47;
            p_Var35 = pp_Var20[-3];
            iVar47 = iVar47 + *(int *)(&this->field_0xdc + (long)p_Var35);
          }
          iVar47 = iVar47 + (iVar26 * iVar28 - iVar61 * iVar14);
          lVar49 = (int)lVar49 + lVar32;
        }
        local_248._0_4_ = uVar62 * 8;
        uVar50 = 0;
        uVar63 = (ulong)uVar62;
        if ((int)uVar62 < 1) {
          uVar63 = uVar50;
        }
        uVar31 = (ulong)uVar39;
        if ((int)uVar39 < 1) {
          uVar31 = uVar50;
        }
        for (uVar36 = 0; uVar36 != uVar31; uVar36 = uVar36 + 1) {
          pvVar59 = (void *)(top_blob->cstep * uVar36 * top_blob->elemsize + (long)top_blob->data);
          pvVar17 = (this->weight_data_tm).data;
          for (iVar28 = 0; iVar28 <= local_2e8; iVar28 = iVar28 + 1) {
            pp_Var20 = this->_vptr_ConvolutionDepthWise_x86_fma;
            for (lVar49 = 0; lVar49 <= iVar40; lVar49 = lVar49 + 1) {
              p_Var35 = pp_Var20[-3];
              if (*(int *)(&this->field_0x100 + (long)p_Var35) == 0) {
                auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar72 = ZEXT3264(*(undefined1 (*) [32])
                                    (*(long *)(&this->field_0x1b0 + (long)p_Var35) + uVar36 * 0x20))
                ;
              }
              for (lVar32 = 0; uVar63 * 4 != lVar32; lVar32 = lVar32 + 4) {
                auVar83 = vfmadd231ps_fma(auVar72._0_32_,
                                          *(undefined1 (*) [32])
                                           ((long)&((Allocator *)
                                                   ((long)local_298.data +
                                                   (long)*(int *)((long)_space_ofs.
                                                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar32)
                                                  * 4 * 8))->_vptr_Allocator +
                                           (long)(*(int *)(&this->field_0xe4 + (long)p_Var35) *
                                                  (int)lVar49 * 8) * 4 +
                                           (long)iVar28 *
                                           (long)*(int *)(&this->field_0xe8 + (long)p_Var35) *
                                           (long)local_298.w * local_298.elemsize +
                                           local_298.cstep * uVar36 * local_298.elemsize),
                                          *(undefined1 (*) [32])
                                           ((long)pvVar17 + lVar32 * 8 + (long)(int)uVar50 * 4));
                auVar72 = ZEXT1664(auVar83);
              }
              *(undefined1 (*) [32])((long)pvVar59 + lVar49 * 0x20) = auVar72._0_32_;
            }
            pvVar59 = (void *)((long)pvVar59 + (long)(iVar43 * 8) * 4);
          }
          uVar50 = (ulong)(uint)((int)uVar50 + (int)local_248);
        }
        pLVar21 = this->activation;
        if (pLVar21 != (Layer *)0x0) {
          (*pLVar21->_vptr_Layer[9])(pLVar21,top_blob,opt);
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    }
    iVar44 = 0;
    goto LAB_003e5288;
  }
LAB_003e3657:
  uVar63 = (long)iVar29 / (long)iVar15;
  uVar31 = (long)iVar44 / (long)iVar15;
  if (opt->use_packing_layout == true) {
    local_308 = (uint)((uVar63 & 3) == 0) * 3 + 1;
    if ((uVar63 & 7) == 0) {
      local_308 = 8;
    }
    uVar39 = (uint)((uVar31 & 3) == 0) * 3 + 1;
    if ((uVar31 & 7) == 0) {
      uVar39 = 8;
    }
  }
  else {
    local_308 = 1;
    uVar39 = 1;
  }
  piVar19 = (int *)CONCAT44(local_298.refcount._4_4_,(int)local_298.refcount);
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)CONCAT44(local_298.refcount._4_4_,(int)local_298.refcount);
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_298.data;
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_298.elemsize;
  uVar66._4_4_ = local_298.w;
  uVar66._0_4_ = local_298.dims;
  uVar73._4_4_ = local_298.d;
  uVar73._0_4_ = local_298.h;
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + 1;
    UNLOCK();
  }
  if ((int)local_308 < iVar28) {
    opt_p.lightmode = opt->lightmode;
    opt_p._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_p.num_threads = opt->num_threads;
    opt_p.workspace_allocator = opt->workspace_allocator;
    opt_p.openmp_blocktime = opt->openmp_blocktime;
    opt_p.use_winograd_convolution = opt->use_winograd_convolution;
    opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_p.use_int8_inference = opt->use_int8_inference;
    opt_p.use_vulkan_compute = opt->use_vulkan_compute;
    opt_p.use_bf16_storage = opt->use_bf16_storage;
    opt_p.use_fp16_packed = opt->use_fp16_packed;
    opt_p.use_fp16_storage = opt->use_fp16_storage;
    opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_p.use_int8_packed = opt->use_int8_packed;
    opt_p.use_int8_storage = opt->use_int8_storage;
    opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_p.use_packing_layout = opt->use_packing_layout;
    opt_p.use_shader_pack8 = opt->use_shader_pack8;
    opt_p.use_subgroup_basic = opt->use_subgroup_basic;
    opt_p.use_subgroup_vote = opt->use_subgroup_vote;
    opt_p.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_p.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_p.use_image_storage = opt->use_image_storage;
    opt_p.use_tensor_storage = opt->use_tensor_storage;
    opt_p.use_reserved_0 = opt->use_reserved_0;
    opt_p.flush_denormals = opt->flush_denormals;
    opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_p.use_shader_local_memory = opt->use_shader_local_memory;
    opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_p.use_reserved_6 = opt->use_reserved_6;
    opt_p.use_reserved_7 = opt->use_reserved_7;
    opt_p.use_reserved_8 = opt->use_reserved_8;
    opt_p.use_reserved_9 = opt->use_reserved_9;
    opt_p.use_reserved_10 = opt->use_reserved_10;
    opt_p.use_reserved_11 = opt->use_reserved_11;
    opt_p.blob_allocator = opt->workspace_allocator;
    convert_packing(&local_298,(Mat *)&_space_ofs,local_308,&opt_p);
  }
  piVar19 = top_blob->refcount;
  opt_p._0_8_ = top_blob->data;
  opt_p.blob_allocator = (Allocator *)top_blob->refcount;
  opt_p.workspace_allocator = (Allocator *)top_blob->elemsize;
  opt_p.openmp_blocktime = top_blob->elempack;
  opt_p._32_8_ = top_blob->allocator;
  opt_p._40_8_ = *(undefined8 *)&top_blob->dims;
  opt_p._48_8_ = *(undefined8 *)&top_blob->h;
  opt_p._56_4_ = top_blob->c;
  sVar16 = top_blob->cstep;
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + 1;
    UNLOCK();
  }
  if (uVar39 < _elempack) {
    Mat::create((Mat *)&opt_p,iVar43,(int)local_248,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) /
                (int)uVar39,(ulong)uVar39 * (local_238 / uVar50),uVar39,opt->workspace_allocator);
    iVar44 = -100;
    if ((opt_p._0_8_ != 0) && ((long)(int)opt_p._56_4_ * sVar16 != 0)) goto LAB_003e387a;
  }
  else {
LAB_003e387a:
    iVar40 = 0;
    iVar28 = 0;
    for (lVar49 = 0;
        lVar49 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
        lVar49 = lVar49 + 1) {
      m.c = (int)uVar63 / (int)local_308;
      m.data = (void *)((long)(iVar40 / (int)local_308) * sVar18 *
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage +
                       (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
      m.refcount = (int *)0x0;
      m.elemsize = (size_t)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      m.elempack = iVar61;
      m.allocator = pAVar25;
      m.cstep = ((long)iVar27 *
                 (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage * (long)iVar47 * (long)iVar14 +
                 0xfU & 0xfffffffffffffff0) /
                (ulong)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      m_1.c = (int)uVar31 / (int)uVar39;
      m_1.data = (void *)((long)(iVar28 / (int)uVar39) * sVar16 * (long)opt_p.workspace_allocator +
                         opt_p._0_8_);
      m_1.refcount = (int *)0x0;
      m_1.elemsize = (size_t)opt_p.workspace_allocator;
      m_1.elempack = opt_p.openmp_blocktime;
      m_1.allocator = (Allocator *)opt_p._32_8_;
      m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                   (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU & 0xfffffffffffffff0
                  ) / (ulong)opt_p.workspace_allocator;
      m_1._40_8_ = opt_p._40_8_;
      m_1._48_8_ = opt_p._48_8_;
      pLVar21 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar49];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_reserved_0 = opt->use_reserved_0;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_shader_local_memory = opt->use_shader_local_memory;
      opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_g.use_reserved_6 = opt->use_reserved_6;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
      m._40_8_ = uVar66;
      m._48_8_ = uVar73;
      (*pLVar21->_vptr_Layer[7])(pLVar21,&m,&m_1,&opt_g);
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) {
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar28 = iVar28 + (int)uVar31;
      iVar40 = iVar40 + (int)uVar63;
    }
    if (uVar39 < _elempack) {
      iVar44 = 0;
      convert_packing((Mat *)&opt_p,top_blob,_elempack,opt);
    }
    else {
      iVar44 = 0;
      if ((Mat *)&opt_p != top_blob) {
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar19 = top_blob->refcount;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = (void *)opt_p._0_8_;
        top_blob->refcount = (int *)opt_p.blob_allocator;
        top_blob->elemsize = (size_t)opt_p.workspace_allocator;
        top_blob->elempack = opt_p.openmp_blocktime;
        top_blob->allocator = (Allocator *)opt_p._32_8_;
        *(undefined8 *)&top_blob->dims = opt_p._40_8_;
        *(undefined8 *)&top_blob->h = opt_p._48_8_;
        top_blob->c = opt_p._56_4_;
        top_blob->cstep = sVar16;
      }
    }
  }
  if (opt_p.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
      if (opt_p._32_8_ == 0) {
        free((void *)opt_p._0_8_);
      }
      else {
        (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
      }
    }
  }
  local_248 = CONCAT44(local_248._4_4_,(int)local_248);
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    LOCK();
    *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    local_248 = CONCAT44(local_248._4_4_,(int)local_248);
    if (*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish == 0) {
      if (pAVar25 == (Allocator *)0x0) {
        free(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
      else {
        (*pAVar25->_vptr_Allocator[3])();
      }
    }
  }
LAB_003e5288:
  piVar19 = (int *)CONCAT44(local_298.refcount._4_4_,(int)local_298.refcount);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        free(local_298.data);
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar44;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}